

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O1

void av1_convolve_y_sr_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn)

{
  int16_t *piVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [15];
  undefined1 auVar134 [15];
  undefined1 auVar135 [15];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [15];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [15];
  undefined1 auVar162 [15];
  undefined1 auVar163 [15];
  undefined1 auVar164 [15];
  undefined1 auVar165 [15];
  undefined1 auVar166 [15];
  undefined1 auVar167 [15];
  undefined1 auVar168 [15];
  undefined1 auVar169 [15];
  undefined1 auVar170 [15];
  undefined1 auVar171 [15];
  undefined1 auVar172 [15];
  undefined1 auVar173 [15];
  undefined1 auVar174 [15];
  undefined1 auVar175 [15];
  undefined1 auVar176 [15];
  undefined1 auVar177 [15];
  undefined1 auVar178 [15];
  undefined1 auVar179 [15];
  undefined1 auVar180 [15];
  undefined1 auVar181 [15];
  undefined1 auVar182 [15];
  undefined1 auVar183 [15];
  undefined1 auVar184 [15];
  undefined1 auVar185 [15];
  undefined1 auVar186 [15];
  undefined1 auVar187 [15];
  undefined1 auVar188 [15];
  undefined1 auVar189 [15];
  undefined1 auVar190 [15];
  undefined1 auVar191 [15];
  undefined1 auVar192 [15];
  undefined1 auVar193 [15];
  undefined1 auVar194 [15];
  undefined1 auVar195 [15];
  undefined1 auVar196 [15];
  undefined1 auVar197 [15];
  undefined1 auVar198 [15];
  undefined1 auVar199 [15];
  undefined1 auVar200 [15];
  undefined1 auVar201 [15];
  undefined1 auVar202 [15];
  undefined1 auVar203 [15];
  undefined1 auVar204 [15];
  undefined1 auVar205 [15];
  undefined1 auVar206 [15];
  undefined1 auVar207 [15];
  undefined1 auVar208 [15];
  undefined1 auVar209 [15];
  undefined1 auVar210 [15];
  undefined1 auVar211 [15];
  undefined1 auVar212 [15];
  undefined1 auVar213 [15];
  undefined1 auVar214 [15];
  undefined1 auVar215 [15];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [15];
  undefined1 auVar219 [15];
  undefined1 auVar220 [15];
  undefined1 auVar221 [15];
  undefined1 auVar222 [15];
  undefined1 auVar223 [15];
  undefined1 auVar224 [15];
  undefined1 auVar225 [15];
  undefined1 auVar226 [15];
  undefined1 auVar227 [15];
  undefined1 auVar228 [15];
  undefined1 auVar229 [15];
  undefined1 auVar230 [15];
  undefined1 auVar231 [15];
  undefined1 auVar232 [15];
  undefined1 auVar233 [15];
  undefined1 auVar234 [15];
  undefined1 auVar235 [15];
  undefined1 auVar236 [15];
  undefined1 auVar237 [15];
  undefined1 auVar238 [15];
  undefined1 auVar239 [15];
  undefined1 auVar240 [15];
  undefined1 auVar241 [15];
  undefined1 auVar242 [15];
  undefined1 auVar243 [15];
  undefined1 auVar244 [15];
  undefined1 auVar245 [15];
  undefined1 auVar246 [15];
  undefined1 auVar247 [15];
  undefined1 auVar248 [15];
  undefined1 auVar249 [15];
  undefined1 auVar250 [15];
  undefined1 auVar251 [15];
  undefined1 auVar252 [15];
  undefined1 auVar253 [15];
  undefined1 auVar254 [15];
  undefined1 auVar255 [15];
  undefined1 auVar256 [15];
  undefined1 auVar257 [15];
  undefined1 auVar258 [15];
  undefined1 auVar259 [15];
  undefined1 auVar260 [15];
  undefined1 auVar261 [15];
  undefined1 auVar262 [15];
  undefined1 auVar263 [15];
  undefined1 auVar264 [15];
  undefined1 auVar265 [15];
  undefined1 auVar266 [15];
  undefined1 auVar267 [15];
  undefined1 auVar268 [15];
  undefined1 auVar269 [15];
  undefined1 auVar270 [15];
  undefined1 auVar271 [15];
  undefined1 auVar272 [15];
  undefined1 auVar273 [15];
  undefined1 auVar274 [15];
  undefined1 auVar275 [15];
  undefined1 auVar276 [15];
  undefined1 auVar277 [15];
  undefined1 auVar278 [15];
  undefined1 auVar279 [15];
  undefined1 auVar280 [15];
  undefined1 auVar281 [15];
  undefined1 auVar282 [15];
  undefined1 auVar283 [15];
  undefined1 auVar284 [15];
  undefined1 auVar285 [15];
  undefined1 auVar286 [15];
  undefined1 auVar287 [15];
  undefined1 auVar288 [15];
  undefined1 auVar289 [15];
  undefined1 auVar290 [15];
  undefined1 auVar291 [15];
  undefined1 auVar292 [15];
  undefined1 auVar293 [15];
  undefined1 auVar294 [15];
  undefined1 auVar295 [15];
  undefined1 auVar296 [15];
  undefined1 auVar297 [15];
  undefined1 auVar298 [15];
  undefined1 auVar299 [15];
  undefined1 auVar300 [15];
  undefined1 auVar301 [15];
  ulong uVar302;
  ulong uVar303;
  ulong uVar304;
  ulong uVar305;
  long lVar306;
  uint8_t *puVar307;
  long lVar308;
  uint8_t *puVar309;
  long lVar310;
  long lVar311;
  long lVar312;
  uint8_t *puVar313;
  ulong uVar314;
  undefined4 uVar315;
  undefined1 uVar324;
  undefined1 uVar325;
  undefined1 uVar326;
  undefined1 uVar327;
  undefined1 uVar328;
  undefined1 uVar329;
  undefined1 uVar330;
  undefined1 auVar316 [16];
  undefined1 auVar331 [16];
  undefined1 uVar343;
  undefined1 auVar332 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  byte bVar354;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  byte bVar377;
  undefined1 uVar400;
  byte bVar401;
  undefined1 uVar402;
  undefined1 uVar403;
  undefined1 uVar404;
  undefined1 auVar378 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar405 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 uVar472;
  undefined1 auVar444 [16];
  undefined1 auVar451 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar473 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar504 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 uVar554;
  undefined1 uVar555;
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar544 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 local_128;
  undefined1 uStack_127;
  undefined1 uStack_126;
  undefined1 uStack_125;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined2 uVar355;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar391 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  
  uVar6 = filter_params_y->taps;
  if (uVar6 < 9) {
    lVar306 = (long)(int)(((uVar6 >> 1) - 1) * src_stride);
    puVar307 = src + -lVar306;
    piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)uVar6;
    uVar315 = *(undefined4 *)piVar1;
    uVar7 = *(undefined4 *)(piVar1 + 2);
    uVar8 = *(undefined4 *)(piVar1 + 4);
    uVar9 = *(undefined4 *)(piVar1 + 6);
    auVar340._4_4_ = uVar315;
    auVar340._0_4_ = uVar315;
    auVar340._8_4_ = uVar315;
    auVar340._12_4_ = uVar315;
    auVar342._4_4_ = uVar7;
    auVar342._0_4_ = uVar7;
    auVar342._8_4_ = uVar7;
    auVar342._12_4_ = uVar7;
    auVar331._4_4_ = uVar8;
    auVar331._0_4_ = uVar8;
    auVar331._8_4_ = uVar8;
    auVar331._12_4_ = uVar8;
    auVar358._4_4_ = uVar9;
    auVar358._0_4_ = uVar9;
    auVar358._8_4_ = uVar9;
    auVar358._12_4_ = uVar9;
    lVar308 = (long)src_stride;
    if (w < 5) {
      uVar7 = *(undefined4 *)puVar307;
      uVar8 = *(undefined4 *)(puVar307 + lVar308);
      uVar400 = (undefined1)((uint)uVar8 >> 0x18);
      uVar343 = (undefined1)((uint)uVar8 >> 0x10);
      uVar330 = (undefined1)((uint)uVar8 >> 8);
      uVar9 = *(undefined4 *)(puVar307 + lVar308 * 2);
      uVar404 = (undefined1)((uint)uVar9 >> 0x18);
      uVar403 = (undefined1)((uint)uVar9 >> 0x10);
      uVar402 = (undefined1)((uint)uVar9 >> 8);
      uVar10 = *(undefined4 *)(puVar307 + lVar308 * 3);
      uVar555 = (undefined1)((uint)uVar10 >> 0x18);
      uVar554 = (undefined1)((uint)uVar10 >> 0x10);
      uVar472 = (undefined1)((uint)uVar10 >> 8);
      uVar11 = *(undefined4 *)(puVar307 + lVar308 * 4);
      uVar329 = (undefined1)((uint)uVar11 >> 0x18);
      uVar328 = (undefined1)((uint)uVar11 >> 0x10);
      uVar327 = (undefined1)((uint)uVar11 >> 8);
      uVar12 = *(undefined4 *)(puVar307 + lVar308 * 5);
      uVar326 = (undefined1)((uint)uVar12 >> 0x18);
      uVar325 = (undefined1)((uint)uVar12 >> 0x10);
      uVar324 = (undefined1)((uint)uVar12 >> 8);
      uVar315 = *(undefined4 *)(puVar307 + lVar308 * 6);
      uVar314 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar326,uVar329),uVar325
                                                                  ),CONCAT14(uVar328,uVar11)) >>
                                                0x20),uVar324),uVar327),
                         CONCAT11((char)uVar12,(char)uVar11));
      uVar4 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar555,uVar404),uVar554),
                                                        CONCAT14(uVar403,uVar9)) >> 0x20),uVar472),
                                uVar402),CONCAT11((char)uVar10,(char)uVar9));
      uVar5 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar400,(char)((uint)uVar7
                                                                                        >> 0x18)),
                                                                 uVar343),
                                                        CONCAT14((char)((uint)uVar7 >> 0x10),uVar7))
                                              >> 0x20),uVar330),(char)((uint)uVar7 >> 8)),
                       CONCAT11((char)uVar8,(char)uVar7));
      uVar3 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar315 >>
                                                                                0x18),uVar326),
                                                                 (char)((uint)uVar315 >> 0x10)),
                                                        CONCAT14(uVar325,uVar12)) >> 0x20),
                                         (char)((uint)uVar315 >> 8)),uVar324),
                       CONCAT11((char)uVar315,(char)uVar12));
      uVar305 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar329,uVar555),uVar328
                                                                  ),CONCAT14(uVar554,uVar10)) >>
                                                0x20),uVar327),uVar472),
                         CONCAT11((char)uVar11,(char)uVar10));
      uVar304 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar404,uVar400),uVar403
                                                                  ),CONCAT14(uVar343,uVar8)) >> 0x20
                                                ),uVar402),uVar330),
                         CONCAT11((char)uVar9,(char)uVar8));
      do {
        uVar303 = uVar305;
        uVar305 = uVar3;
        uVar302 = uVar4;
        uVar4 = uVar314;
        uVar7 = *(undefined4 *)(puVar307 + lVar308 * 7);
        uVar329 = (undefined1)((uint)uVar7 >> 0x18);
        uVar326 = (undefined1)((uint)uVar315 >> 0x18);
        uVar328 = (undefined1)((uint)uVar7 >> 0x10);
        uVar325 = (undefined1)((uint)uVar315 >> 0x10);
        uVar327 = (undefined1)((uint)uVar7 >> 8);
        uVar324 = (undefined1)((uint)uVar315 >> 8);
        bVar354 = (byte)uVar315;
        bVar377 = (byte)uVar7;
        uVar355 = CONCAT11(bVar377,bVar354);
        uVar314 = CONCAT62(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(uVar329,uVar326),uVar328),
                                                      uVar325),uVar327),uVar324),uVar355);
        uVar315 = *(undefined4 *)(puVar307 + lVar308 * 8);
        auVar48._8_6_ = 0;
        auVar48._0_8_ = uVar5;
        auVar48[0xe] = (char)(uVar5 >> 0x38);
        auVar76._8_4_ = 0;
        auVar76._0_8_ = uVar5;
        auVar76[0xc] = (char)(uVar5 >> 0x30);
        auVar76._13_2_ = auVar48._13_2_;
        auVar104._8_4_ = 0;
        auVar104._0_8_ = uVar5;
        auVar104._12_3_ = auVar76._12_3_;
        auVar132._8_2_ = 0;
        auVar132._0_8_ = uVar5;
        auVar132[10] = (char)(uVar5 >> 0x28);
        auVar132._11_4_ = auVar104._11_4_;
        auVar160._8_2_ = 0;
        auVar160._0_8_ = uVar5;
        auVar160._10_5_ = auVar132._10_5_;
        auVar188[8] = (char)(uVar5 >> 0x20);
        auVar188._0_8_ = uVar5;
        auVar188._9_6_ = auVar160._9_6_;
        auVar218._7_8_ = 0;
        auVar218._0_7_ = auVar188._8_7_;
        auVar246._1_8_ = SUB158(auVar218 << 0x40,7);
        auVar246[0] = (char)(uVar5 >> 0x18);
        auVar246._9_6_ = 0;
        auVar247._1_10_ = SUB1510(auVar246 << 0x30,5);
        auVar247[0] = (char)(uVar5 >> 0x10);
        auVar247._11_4_ = 0;
        auVar344._3_12_ = SUB1512(auVar247 << 0x20,3);
        auVar344[2] = (char)(uVar5 >> 8);
        auVar344[0] = (byte)uVar5;
        auVar344[1] = 0;
        auVar344[0xf] = 0;
        auVar21._8_6_ = 0;
        auVar21._0_8_ = uVar302;
        auVar21[0xe] = (char)(uVar302 >> 0x38);
        auVar49._8_4_ = 0;
        auVar49._0_8_ = uVar302;
        auVar49[0xc] = (char)(uVar302 >> 0x30);
        auVar49._13_2_ = auVar21._13_2_;
        auVar77._8_4_ = 0;
        auVar77._0_8_ = uVar302;
        auVar77._12_3_ = auVar49._12_3_;
        auVar105._8_2_ = 0;
        auVar105._0_8_ = uVar302;
        auVar105[10] = (char)(uVar302 >> 0x28);
        auVar105._11_4_ = auVar77._11_4_;
        auVar133._8_2_ = 0;
        auVar133._0_8_ = uVar302;
        auVar133._10_5_ = auVar105._10_5_;
        auVar161[8] = (char)(uVar302 >> 0x20);
        auVar161._0_8_ = uVar302;
        auVar161._9_6_ = auVar133._9_6_;
        auVar219._7_8_ = 0;
        auVar219._0_7_ = auVar161._8_7_;
        auVar248._1_8_ = SUB158(auVar219 << 0x40,7);
        auVar248[0] = (char)(uVar302 >> 0x18);
        auVar248._9_6_ = 0;
        auVar249._1_10_ = SUB1510(auVar248 << 0x30,5);
        auVar249[0] = (char)(uVar302 >> 0x10);
        auVar249._11_4_ = 0;
        auVar189[2] = (char)(uVar302 >> 8);
        auVar189._0_2_ = (ushort)uVar302;
        auVar189._3_12_ = SUB1512(auVar249 << 0x20,3);
        auVar517._0_2_ = (ushort)uVar302 & 0xff;
        auVar517._2_13_ = auVar189._2_13_;
        auVar517[0xf] = 0;
        auVar22._8_6_ = 0;
        auVar22._0_8_ = uVar4;
        auVar22[0xe] = (char)(uVar4 >> 0x38);
        auVar50._8_4_ = 0;
        auVar50._0_8_ = uVar4;
        auVar50[0xc] = (char)(uVar4 >> 0x30);
        auVar50._13_2_ = auVar22._13_2_;
        auVar78._8_4_ = 0;
        auVar78._0_8_ = uVar4;
        auVar78._12_3_ = auVar50._12_3_;
        auVar106._8_2_ = 0;
        auVar106._0_8_ = uVar4;
        auVar106[10] = (char)(uVar4 >> 0x28);
        auVar106._11_4_ = auVar78._11_4_;
        auVar134._8_2_ = 0;
        auVar134._0_8_ = uVar4;
        auVar134._10_5_ = auVar106._10_5_;
        auVar162[8] = (char)(uVar4 >> 0x20);
        auVar162._0_8_ = uVar4;
        auVar162._9_6_ = auVar134._9_6_;
        auVar220._7_8_ = 0;
        auVar220._0_7_ = auVar162._8_7_;
        auVar250._1_8_ = SUB158(auVar220 << 0x40,7);
        auVar250[0] = (char)(uVar4 >> 0x18);
        auVar250._9_6_ = 0;
        auVar251._1_10_ = SUB1510(auVar250 << 0x30,5);
        auVar251[0] = (char)(uVar4 >> 0x10);
        auVar251._11_4_ = 0;
        auVar190[2] = (char)(uVar4 >> 8);
        auVar190._0_2_ = (ushort)uVar4;
        auVar190._3_12_ = SUB1512(auVar251 << 0x20,3);
        auVar535._0_2_ = (ushort)uVar4 & 0xff;
        auVar535._2_13_ = auVar190._2_13_;
        auVar535[0xf] = 0;
        auVar23._8_6_ = 0;
        auVar23._0_8_ = uVar314;
        auVar23[0xe] = uVar329;
        auVar51._8_4_ = 0;
        auVar51._0_8_ = uVar314;
        auVar51[0xc] = uVar326;
        auVar51._13_2_ = auVar23._13_2_;
        auVar79._8_4_ = 0;
        auVar79._0_8_ = uVar314;
        auVar79._12_3_ = auVar51._12_3_;
        auVar107._8_2_ = 0;
        auVar107._0_8_ = uVar314;
        auVar107[10] = uVar328;
        auVar107._11_4_ = auVar79._11_4_;
        auVar135._8_2_ = 0;
        auVar135._0_8_ = uVar314;
        auVar135._10_5_ = auVar107._10_5_;
        auVar163[8] = uVar325;
        auVar163._0_8_ = uVar314;
        auVar163._9_6_ = auVar135._9_6_;
        auVar221._7_8_ = 0;
        auVar221._0_7_ = auVar163._8_7_;
        auVar252._1_8_ = SUB158(auVar221 << 0x40,7);
        auVar252[0] = uVar327;
        auVar252._9_6_ = 0;
        auVar253._1_10_ = SUB1510(auVar252 << 0x30,5);
        auVar253[0] = uVar324;
        auVar253._11_4_ = 0;
        auVar191[2] = bVar377;
        auVar191._0_2_ = uVar355;
        auVar191._3_12_ = SUB1512(auVar253 << 0x20,3);
        auVar483[1] = 0;
        auVar483[0] = bVar354;
        auVar483._2_13_ = auVar191._2_13_;
        auVar483[0xf] = 0;
        auVar360 = pmaddwd(auVar344,auVar340);
        auVar422 = pmaddwd(auVar517,auVar342);
        auVar424 = pmaddwd(auVar535,auVar331);
        auVar362 = pmaddwd(auVar483,auVar358);
        auVar484._0_4_ =
             auVar362._0_4_ + auVar424._0_4_ + auVar422._0_4_ + auVar360._0_4_ + 0x40 >> 7;
        auVar484._4_4_ =
             auVar362._4_4_ + auVar424._4_4_ + auVar422._4_4_ + auVar360._4_4_ + 0x40 >> 7;
        auVar484._8_4_ =
             auVar362._8_4_ + auVar424._8_4_ + auVar422._8_4_ + auVar360._8_4_ + 0x40 >> 7;
        auVar484._12_4_ =
             auVar362._12_4_ + auVar424._12_4_ + auVar422._12_4_ + auVar360._12_4_ + 0x40 >> 7;
        auVar360 = packssdw(auVar484,auVar484);
        sVar13 = auVar360._0_2_;
        sVar14 = auVar360._2_2_;
        uVar355 = CONCAT11((0 < sVar14) * (sVar14 < 0x100) * auVar360[2] - (0xff < sVar14),
                           (0 < sVar13) * (sVar13 < 0x100) * auVar360[0] - (0xff < sVar13));
        sVar13 = auVar360._4_2_;
        sVar14 = auVar360._6_2_;
        if (w == 2) {
          *(undefined2 *)dst = uVar355;
        }
        else {
          *(uint *)dst = CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar360[6] - (0xff < sVar14),
                                  CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar360[4] -
                                           (0xff < sVar13),uVar355));
        }
        local_128 = (undefined1)uVar315;
        uStack_127 = (undefined1)((uint)uVar315 >> 8);
        uStack_126 = (undefined1)((uint)uVar315 >> 0x10);
        uStack_125 = (undefined1)((uint)uVar315 >> 0x18);
        uVar3 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uStack_125,uVar329),
                                                                   uStack_126),
                                                          CONCAT14(uVar328,uVar7)) >> 0x20),
                                           uStack_127),uVar327),CONCAT11(local_128,bVar377));
        puVar309 = dst + dst_stride;
        auVar24._8_6_ = 0;
        auVar24._0_8_ = uVar304;
        auVar24[0xe] = (char)(uVar304 >> 0x38);
        auVar52._8_4_ = 0;
        auVar52._0_8_ = uVar304;
        auVar52[0xc] = (char)(uVar304 >> 0x30);
        auVar52._13_2_ = auVar24._13_2_;
        auVar80._8_4_ = 0;
        auVar80._0_8_ = uVar304;
        auVar80._12_3_ = auVar52._12_3_;
        auVar108._8_2_ = 0;
        auVar108._0_8_ = uVar304;
        auVar108[10] = (char)(uVar304 >> 0x28);
        auVar108._11_4_ = auVar80._11_4_;
        auVar136._8_2_ = 0;
        auVar136._0_8_ = uVar304;
        auVar136._10_5_ = auVar108._10_5_;
        auVar164[8] = (char)(uVar304 >> 0x20);
        auVar164._0_8_ = uVar304;
        auVar164._9_6_ = auVar136._9_6_;
        auVar222._7_8_ = 0;
        auVar222._0_7_ = auVar164._8_7_;
        auVar254._1_8_ = SUB158(auVar222 << 0x40,7);
        auVar254[0] = (char)(uVar304 >> 0x18);
        auVar254._9_6_ = 0;
        auVar255._1_10_ = SUB1510(auVar254 << 0x30,5);
        auVar255[0] = (char)(uVar304 >> 0x10);
        auVar255._11_4_ = 0;
        auVar192[2] = (char)(uVar304 >> 8);
        auVar192._0_2_ = (ushort)uVar304;
        auVar192._3_12_ = SUB1512(auVar255 << 0x20,3);
        auVar435._0_2_ = (ushort)uVar304 & 0xff;
        auVar435._2_13_ = auVar192._2_13_;
        auVar435[0xf] = 0;
        auVar25._8_6_ = 0;
        auVar25._0_8_ = uVar303;
        auVar25[0xe] = (char)(uVar303 >> 0x38);
        auVar53._8_4_ = 0;
        auVar53._0_8_ = uVar303;
        auVar53[0xc] = (char)(uVar303 >> 0x30);
        auVar53._13_2_ = auVar25._13_2_;
        auVar81._8_4_ = 0;
        auVar81._0_8_ = uVar303;
        auVar81._12_3_ = auVar53._12_3_;
        auVar109._8_2_ = 0;
        auVar109._0_8_ = uVar303;
        auVar109[10] = (char)(uVar303 >> 0x28);
        auVar109._11_4_ = auVar81._11_4_;
        auVar137._8_2_ = 0;
        auVar137._0_8_ = uVar303;
        auVar137._10_5_ = auVar109._10_5_;
        auVar165[8] = (char)(uVar303 >> 0x20);
        auVar165._0_8_ = uVar303;
        auVar165._9_6_ = auVar137._9_6_;
        auVar223._7_8_ = 0;
        auVar223._0_7_ = auVar165._8_7_;
        auVar256._1_8_ = SUB158(auVar223 << 0x40,7);
        auVar256[0] = (char)(uVar303 >> 0x18);
        auVar256._9_6_ = 0;
        auVar257._1_10_ = SUB1510(auVar256 << 0x30,5);
        auVar257[0] = (char)(uVar303 >> 0x10);
        auVar257._11_4_ = 0;
        auVar193[2] = (char)(uVar303 >> 8);
        auVar193._0_2_ = (ushort)uVar303;
        auVar193._3_12_ = SUB1512(auVar257 << 0x20,3);
        auVar345._0_2_ = (ushort)uVar303 & 0xff;
        auVar345._2_13_ = auVar193._2_13_;
        auVar345[0xf] = 0;
        auVar26._8_6_ = 0;
        auVar26._0_8_ = uVar305;
        auVar26[0xe] = (char)(uVar305 >> 0x38);
        auVar54._8_4_ = 0;
        auVar54._0_8_ = uVar305;
        auVar54[0xc] = (char)(uVar305 >> 0x30);
        auVar54._13_2_ = auVar26._13_2_;
        auVar82._8_4_ = 0;
        auVar82._0_8_ = uVar305;
        auVar82._12_3_ = auVar54._12_3_;
        auVar110._8_2_ = 0;
        auVar110._0_8_ = uVar305;
        auVar110[10] = (char)(uVar305 >> 0x28);
        auVar110._11_4_ = auVar82._11_4_;
        auVar138._8_2_ = 0;
        auVar138._0_8_ = uVar305;
        auVar138._10_5_ = auVar110._10_5_;
        auVar166[8] = (char)(uVar305 >> 0x20);
        auVar166._0_8_ = uVar305;
        auVar166._9_6_ = auVar138._9_6_;
        auVar224._7_8_ = 0;
        auVar224._0_7_ = auVar166._8_7_;
        auVar258._1_8_ = SUB158(auVar224 << 0x40,7);
        auVar258[0] = (char)(uVar305 >> 0x18);
        auVar258._9_6_ = 0;
        auVar259._1_10_ = SUB1510(auVar258 << 0x30,5);
        auVar259[0] = (char)(uVar305 >> 0x10);
        auVar259._11_4_ = 0;
        auVar194[2] = (char)(uVar305 >> 8);
        auVar194._0_2_ = (ushort)uVar305;
        auVar194._3_12_ = SUB1512(auVar259 << 0x20,3);
        auVar485._0_2_ = (ushort)uVar305 & 0xff;
        auVar485._2_13_ = auVar194._2_13_;
        auVar485[0xf] = 0;
        auVar27._8_6_ = 0;
        auVar27._0_8_ = uVar3;
        auVar27[0xe] = uStack_125;
        auVar55._8_4_ = 0;
        auVar55._0_8_ = uVar3;
        auVar55[0xc] = uVar329;
        auVar55._13_2_ = auVar27._13_2_;
        auVar83._8_4_ = 0;
        auVar83._0_8_ = uVar3;
        auVar83._12_3_ = auVar55._12_3_;
        auVar111._8_2_ = 0;
        auVar111._0_8_ = uVar3;
        auVar111[10] = uStack_126;
        auVar111._11_4_ = auVar83._11_4_;
        auVar139._8_2_ = 0;
        auVar139._0_8_ = uVar3;
        auVar139._10_5_ = auVar111._10_5_;
        auVar167[8] = uVar328;
        auVar167._0_8_ = uVar3;
        auVar167._9_6_ = auVar139._9_6_;
        auVar225._7_8_ = 0;
        auVar225._0_7_ = auVar167._8_7_;
        auVar260._1_8_ = SUB158(auVar225 << 0x40,7);
        auVar260[0] = uStack_127;
        auVar260._9_6_ = 0;
        auVar261._1_10_ = SUB1510(auVar260 << 0x30,5);
        auVar261[0] = uVar327;
        auVar261._11_4_ = 0;
        auVar195[2] = local_128;
        auVar195._0_2_ = CONCAT11(local_128,bVar377);
        auVar195._3_12_ = SUB1512(auVar261 << 0x20,3);
        auVar518[1] = 0;
        auVar518[0] = bVar377;
        auVar518._2_13_ = auVar195._2_13_;
        auVar518[0xf] = 0;
        auVar362 = pmaddwd(auVar435,auVar340);
        auVar360 = pmaddwd(auVar345,auVar342);
        auVar422 = pmaddwd(auVar485,auVar331);
        auVar424 = pmaddwd(auVar518,auVar358);
        auVar519._0_4_ =
             auVar424._0_4_ + auVar422._0_4_ + auVar360._0_4_ + auVar362._0_4_ + 0x40 >> 7;
        auVar519._4_4_ =
             auVar424._4_4_ + auVar422._4_4_ + auVar360._4_4_ + auVar362._4_4_ + 0x40 >> 7;
        auVar519._8_4_ =
             auVar424._8_4_ + auVar422._8_4_ + auVar360._8_4_ + auVar362._8_4_ + 0x40 >> 7;
        auVar519._12_4_ =
             auVar424._12_4_ + auVar422._12_4_ + auVar360._12_4_ + auVar362._12_4_ + 0x40 >> 7;
        auVar360 = packssdw(auVar519,auVar519);
        sVar13 = auVar360._0_2_;
        sVar14 = auVar360._2_2_;
        uVar355 = CONCAT11((0 < sVar14) * (sVar14 < 0x100) * auVar360[2] - (0xff < sVar14),
                           (0 < sVar13) * (sVar13 < 0x100) * auVar360[0] - (0xff < sVar13));
        sVar13 = auVar360._4_2_;
        sVar14 = auVar360._6_2_;
        if (w == 2) {
          *(undefined2 *)puVar309 = uVar355;
        }
        else {
          *(uint *)puVar309 =
               CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar360[6] - (0xff < sVar14),
                        CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar360[4] - (0xff < sVar13),
                                 uVar355));
        }
        puVar307 = puVar307 + lVar308 * 2;
        dst = puVar309 + dst_stride;
        h = h + -2;
        uVar5 = uVar302;
        uVar304 = uVar303;
      } while (h != 0);
    }
    else {
      lVar310 = src_stride * 8 - lVar306;
      lVar306 = src_stride * 7 - lVar306;
      uVar314 = 0;
      do {
        uVar3 = *(ulong *)(puVar307 + lVar308 * 6 + uVar314);
        uVar4 = *(ulong *)(puVar307 + uVar314);
        uVar5 = *(ulong *)(puVar307 + lVar308 + uVar314);
        uVar329 = (undefined1)(uVar5 >> 0x38);
        auVar510._8_6_ = 0;
        auVar510._0_8_ = uVar4;
        auVar510[0xe] = (char)(uVar4 >> 0x38);
        auVar510[0xf] = uVar329;
        uVar328 = (undefined1)(uVar5 >> 0x30);
        auVar509._14_2_ = auVar510._14_2_;
        auVar509._8_5_ = 0;
        auVar509._0_8_ = uVar4;
        auVar509[0xd] = uVar328;
        auVar508._13_3_ = auVar509._13_3_;
        auVar508._8_4_ = 0;
        auVar508._0_8_ = uVar4;
        auVar508[0xc] = (char)(uVar4 >> 0x30);
        uVar327 = (undefined1)(uVar5 >> 0x28);
        auVar507._12_4_ = auVar508._12_4_;
        auVar507._8_3_ = 0;
        auVar507._0_8_ = uVar4;
        auVar507[0xb] = uVar327;
        auVar506._11_5_ = auVar507._11_5_;
        auVar506._8_2_ = 0;
        auVar506._0_8_ = uVar4;
        auVar506[10] = (char)(uVar4 >> 0x28);
        uVar326 = (undefined1)(uVar5 >> 0x20);
        auVar505._10_6_ = auVar506._10_6_;
        auVar505[8] = 0;
        auVar505._0_8_ = uVar4;
        auVar505[9] = uVar326;
        auVar504._9_7_ = auVar505._9_7_;
        auVar504[8] = (char)(uVar4 >> 0x20);
        auVar504._0_8_ = uVar4;
        uVar325 = (undefined1)(uVar5 >> 0x18);
        auVar459._8_8_ = auVar504._8_8_;
        auVar459[7] = uVar325;
        auVar459[6] = (char)(uVar4 >> 0x18);
        uVar324 = (undefined1)(uVar5 >> 0x10);
        auVar459[5] = uVar324;
        auVar459[4] = (char)(uVar4 >> 0x10);
        uVar343 = (undefined1)(uVar5 >> 8);
        auVar459[3] = uVar343;
        auVar459[2] = (char)(uVar4 >> 8);
        auVar424[0] = (undefined1)uVar5;
        auVar459[0] = (undefined1)uVar4;
        auVar459[1] = auVar424[0];
        uVar4 = *(ulong *)(puVar307 + lVar308 * 2 + uVar314);
        uVar330 = (undefined1)(uVar4 >> 0x38);
        auVar479._8_6_ = 0;
        auVar479._0_8_ = uVar5;
        auVar479[0xe] = uVar329;
        auVar479[0xf] = uVar330;
        uVar329 = (undefined1)(uVar4 >> 0x30);
        auVar478._14_2_ = auVar479._14_2_;
        auVar478._8_5_ = 0;
        auVar478._0_8_ = uVar5;
        auVar478[0xd] = uVar329;
        auVar477._13_3_ = auVar478._13_3_;
        auVar477._8_4_ = 0;
        auVar477._0_8_ = uVar5;
        auVar477[0xc] = uVar328;
        uVar328 = (undefined1)(uVar4 >> 0x28);
        auVar476._12_4_ = auVar477._12_4_;
        auVar476._8_3_ = 0;
        auVar476._0_8_ = uVar5;
        auVar476[0xb] = uVar328;
        auVar475._11_5_ = auVar476._11_5_;
        auVar475._8_2_ = 0;
        auVar475._0_8_ = uVar5;
        auVar475[10] = uVar327;
        uVar327 = (undefined1)(uVar4 >> 0x20);
        auVar474._10_6_ = auVar475._10_6_;
        auVar474[8] = 0;
        auVar474._0_8_ = uVar5;
        auVar474[9] = uVar327;
        auVar473._9_7_ = auVar474._9_7_;
        auVar473[8] = uVar326;
        auVar473._0_8_ = uVar5;
        uVar326 = (undefined1)(uVar4 >> 0x18);
        auVar424._8_8_ = auVar473._8_8_;
        auVar424[7] = uVar326;
        auVar424[6] = uVar325;
        uVar325 = (undefined1)(uVar4 >> 0x10);
        auVar424[5] = uVar325;
        auVar424[4] = uVar324;
        uVar324 = (undefined1)(uVar4 >> 8);
        auVar424[3] = uVar324;
        auVar424[2] = uVar343;
        auVar362[0] = (undefined1)uVar4;
        auVar424[1] = auVar362[0];
        uVar5 = *(ulong *)(puVar307 + lVar308 * 3 + uVar314);
        uVar343 = (undefined1)(uVar5 >> 0x38);
        auVar434._8_6_ = 0;
        auVar434._0_8_ = uVar4;
        auVar434[0xe] = uVar330;
        auVar434[0xf] = uVar343;
        auVar433._14_2_ = auVar434._14_2_;
        auVar433._8_5_ = 0;
        auVar433._0_8_ = uVar4;
        uVar330 = (undefined1)(uVar5 >> 0x30);
        auVar433[0xd] = uVar330;
        auVar432._13_3_ = auVar433._13_3_;
        auVar432._8_4_ = 0;
        auVar432._0_8_ = uVar4;
        auVar432[0xc] = uVar329;
        auVar431._12_4_ = auVar432._12_4_;
        auVar431._8_3_ = 0;
        auVar431._0_8_ = uVar4;
        uVar329 = (undefined1)(uVar5 >> 0x28);
        auVar431[0xb] = uVar329;
        auVar430._11_5_ = auVar431._11_5_;
        auVar430._8_2_ = 0;
        auVar430._0_8_ = uVar4;
        auVar430[10] = uVar328;
        auVar429._10_6_ = auVar430._10_6_;
        auVar429[8] = 0;
        auVar429._0_8_ = uVar4;
        uVar328 = (undefined1)(uVar5 >> 0x20);
        auVar429[9] = uVar328;
        auVar428._9_7_ = auVar429._9_7_;
        auVar428[8] = uVar327;
        auVar428._0_8_ = uVar4;
        auVar362._8_8_ = auVar428._8_8_;
        uVar327 = (undefined1)(uVar5 >> 0x18);
        auVar362[7] = uVar327;
        auVar362[6] = uVar326;
        uVar326 = (undefined1)(uVar5 >> 0x10);
        auVar362[5] = uVar326;
        auVar362[4] = uVar325;
        uVar325 = (undefined1)(uVar5 >> 8);
        auVar362[3] = uVar325;
        auVar362[2] = uVar324;
        auVar422[0] = (undefined1)uVar5;
        auVar362[1] = auVar422[0];
        uVar4 = *(ulong *)(puVar307 + lVar308 * 4 + uVar314);
        uVar472 = (undefined1)(uVar4 >> 0x38);
        auVar471._8_6_ = 0;
        auVar471._0_8_ = uVar5;
        auVar471[0xe] = uVar343;
        auVar471[0xf] = uVar472;
        auVar470._14_2_ = auVar471._14_2_;
        auVar470._8_5_ = 0;
        auVar470._0_8_ = uVar5;
        uVar404 = (undefined1)(uVar4 >> 0x30);
        auVar470[0xd] = uVar404;
        auVar469._13_3_ = auVar470._13_3_;
        auVar469._8_4_ = 0;
        auVar469._0_8_ = uVar5;
        auVar469[0xc] = uVar330;
        auVar468._12_4_ = auVar469._12_4_;
        auVar468._8_3_ = 0;
        auVar468._0_8_ = uVar5;
        uVar403 = (undefined1)(uVar4 >> 0x28);
        auVar468[0xb] = uVar403;
        auVar467._11_5_ = auVar468._11_5_;
        auVar467._8_2_ = 0;
        auVar467._0_8_ = uVar5;
        auVar467[10] = uVar329;
        auVar466._10_6_ = auVar467._10_6_;
        auVar466[8] = 0;
        auVar466._0_8_ = uVar5;
        uVar402 = (undefined1)(uVar4 >> 0x20);
        auVar466[9] = uVar402;
        auVar465._9_7_ = auVar466._9_7_;
        auVar465[8] = uVar328;
        auVar465._0_8_ = uVar5;
        auVar422._8_8_ = auVar465._8_8_;
        uVar400 = (undefined1)(uVar4 >> 0x18);
        auVar422[7] = uVar400;
        auVar422[6] = uVar327;
        uVar324 = (undefined1)(uVar4 >> 0x10);
        auVar422[5] = uVar324;
        auVar422[4] = uVar326;
        uVar343 = (undefined1)(uVar4 >> 8);
        auVar422[3] = uVar343;
        auVar422[2] = uVar325;
        auVar461[0] = (undefined1)uVar4;
        auVar422[1] = auVar461[0];
        uVar5 = *(ulong *)(puVar307 + lVar308 * 5 + uVar314);
        uVar330 = (undefined1)(uVar5 >> 0x38);
        auVar550._8_6_ = 0;
        auVar550._0_8_ = uVar4;
        auVar550[0xe] = uVar472;
        auVar550[0xf] = uVar330;
        uVar329 = (undefined1)(uVar5 >> 0x30);
        auVar549._14_2_ = auVar550._14_2_;
        auVar549._8_5_ = 0;
        auVar549._0_8_ = uVar4;
        auVar549[0xd] = uVar329;
        auVar548._13_3_ = auVar549._13_3_;
        auVar548._8_4_ = 0;
        auVar548._0_8_ = uVar4;
        auVar548[0xc] = uVar404;
        uVar328 = (undefined1)(uVar5 >> 0x28);
        auVar547._12_4_ = auVar548._12_4_;
        auVar547._8_3_ = 0;
        auVar547._0_8_ = uVar4;
        auVar547[0xb] = uVar328;
        auVar546._11_5_ = auVar547._11_5_;
        auVar546._8_2_ = 0;
        auVar546._0_8_ = uVar4;
        auVar546[10] = uVar403;
        uVar327 = (undefined1)(uVar5 >> 0x20);
        auVar545._10_6_ = auVar546._10_6_;
        auVar545[8] = 0;
        auVar545._0_8_ = uVar4;
        auVar545[9] = uVar327;
        auVar544._9_7_ = auVar545._9_7_;
        auVar544[8] = uVar402;
        auVar544._0_8_ = uVar4;
        uVar326 = (undefined1)(uVar5 >> 0x18);
        auVar461._8_8_ = auVar544._8_8_;
        auVar461[7] = uVar326;
        auVar461[6] = uVar400;
        uVar325 = (undefined1)(uVar5 >> 0x10);
        auVar461[5] = uVar325;
        auVar461[4] = uVar324;
        uVar324 = (undefined1)(uVar5 >> 8);
        auVar461[3] = uVar324;
        auVar461[2] = uVar343;
        auVar360[0] = (undefined1)uVar5;
        auVar461[1] = auVar360[0];
        auVar552._8_6_ = 0;
        auVar552._0_8_ = uVar5;
        auVar552[0xe] = uVar330;
        auVar552[0xf] = (char)(uVar3 >> 0x38);
        auVar534._14_2_ = auVar552._14_2_;
        auVar534._8_5_ = 0;
        auVar534._0_8_ = uVar5;
        auVar534[0xd] = (char)(uVar3 >> 0x30);
        auVar531._13_3_ = auVar534._13_3_;
        auVar531._8_4_ = 0;
        auVar531._0_8_ = uVar5;
        auVar531[0xc] = uVar329;
        auVar495._12_4_ = auVar531._12_4_;
        auVar495._8_3_ = 0;
        auVar495._0_8_ = uVar5;
        auVar495[0xb] = (char)(uVar3 >> 0x28);
        auVar391._11_5_ = auVar495._11_5_;
        auVar391._8_2_ = 0;
        auVar391._0_8_ = uVar5;
        auVar391[10] = uVar328;
        auVar390._10_6_ = auVar391._10_6_;
        auVar390[8] = 0;
        auVar390._0_8_ = uVar5;
        auVar390[9] = (char)(uVar3 >> 0x20);
        auVar529._9_7_ = auVar390._9_7_;
        auVar529[8] = uVar327;
        auVar529._0_8_ = uVar5;
        auVar360._8_8_ = auVar529._8_8_;
        auVar360[7] = (char)(uVar3 >> 0x18);
        auVar360[6] = uVar326;
        auVar360[5] = (char)(uVar3 >> 0x10);
        auVar360[4] = uVar325;
        auVar360[3] = (char)(uVar3 >> 8);
        auVar360[2] = uVar324;
        auVar360[1] = (char)uVar3;
        lVar312 = 0;
        puVar309 = dst;
        puVar313 = src;
        do {
          auVar390 = auVar422;
          auVar391 = auVar362;
          auVar422 = auVar360;
          auVar40[0xd] = 0;
          auVar40._0_13_ = auVar459._0_13_;
          auVar40[0xe] = auVar459[7];
          auVar68[0xc] = auVar459[6];
          auVar68._0_12_ = auVar459._0_12_;
          auVar68._13_2_ = auVar40._13_2_;
          auVar96[0xb] = 0;
          auVar96._0_11_ = auVar459._0_11_;
          auVar96._12_3_ = auVar68._12_3_;
          auVar124[10] = auVar459[5];
          auVar124._0_10_ = auVar459._0_10_;
          auVar124._11_4_ = auVar96._11_4_;
          auVar152[9] = 0;
          auVar152._0_9_ = auVar459._0_9_;
          auVar152._10_5_ = auVar124._10_5_;
          auVar180[8] = auVar459[4];
          auVar180._0_8_ = auVar459._0_8_;
          auVar180._9_6_ = auVar152._9_6_;
          auVar238._7_8_ = 0;
          auVar238._0_7_ = auVar180._8_7_;
          auVar286._1_8_ = SUB158(auVar238 << 0x40,7);
          auVar286[0] = auVar459[3];
          auVar286._9_6_ = 0;
          auVar287._1_10_ = SUB1510(auVar286 << 0x30,5);
          auVar287[0] = auVar459[2];
          auVar287._11_4_ = 0;
          auVar208[2] = auVar459[1];
          auVar208._0_2_ = auVar459._0_2_;
          auVar208._3_12_ = SUB1512(auVar287 << 0x20,3);
          auVar392._0_2_ = auVar459._0_2_ & 0xff;
          auVar392._2_13_ = auVar208._2_13_;
          auVar392[0xf] = 0;
          auVar41[0xd] = 0;
          auVar41._0_13_ = auVar391._0_13_;
          auVar41[0xe] = auVar391[7];
          auVar69[0xc] = auVar391[6];
          auVar69._0_12_ = auVar391._0_12_;
          auVar69._13_2_ = auVar41._13_2_;
          auVar97[0xb] = 0;
          auVar97._0_11_ = auVar391._0_11_;
          auVar97._12_3_ = auVar69._12_3_;
          auVar125[10] = auVar391[5];
          auVar125._0_10_ = auVar391._0_10_;
          auVar125._11_4_ = auVar97._11_4_;
          auVar153[9] = 0;
          auVar153._0_9_ = auVar391._0_9_;
          auVar153._10_5_ = auVar125._10_5_;
          auVar181[8] = auVar391[4];
          auVar181._0_8_ = auVar391._0_8_;
          auVar181._9_6_ = auVar153._9_6_;
          auVar239._7_8_ = 0;
          auVar239._0_7_ = auVar181._8_7_;
          auVar288._1_8_ = SUB158(auVar239 << 0x40,7);
          auVar288[0] = auVar391[3];
          auVar288._9_6_ = 0;
          auVar289._1_10_ = SUB1510(auVar288 << 0x30,5);
          auVar289[0] = auVar391[2];
          auVar289._11_4_ = 0;
          auVar209[2] = auVar391[1];
          auVar209._0_2_ = auVar391._0_2_;
          auVar209._3_12_ = SUB1512(auVar289 << 0x20,3);
          auVar413._0_2_ = auVar391._0_2_ & 0xff;
          auVar413._2_13_ = auVar209._2_13_;
          auVar413[0xf] = 0;
          auVar360 = pmaddwd(auVar392,auVar340);
          auVar362 = pmaddwd(auVar413,auVar342);
          auVar42[0xd] = 0;
          auVar42._0_13_ = auVar461._0_13_;
          auVar42[0xe] = auVar461[7];
          auVar70[0xc] = auVar461[6];
          auVar70._0_12_ = auVar461._0_12_;
          auVar70._13_2_ = auVar42._13_2_;
          auVar98[0xb] = 0;
          auVar98._0_11_ = auVar461._0_11_;
          auVar98._12_3_ = auVar70._12_3_;
          auVar126[10] = auVar461[5];
          auVar126._0_10_ = auVar461._0_10_;
          auVar126._11_4_ = auVar98._11_4_;
          auVar154[9] = 0;
          auVar154._0_9_ = auVar461._0_9_;
          auVar154._10_5_ = auVar126._10_5_;
          auVar182[8] = auVar461[4];
          auVar182._0_8_ = auVar461._0_8_;
          auVar182._9_6_ = auVar154._9_6_;
          auVar240._7_8_ = 0;
          auVar240._0_7_ = auVar182._8_7_;
          auVar290._1_8_ = SUB158(auVar240 << 0x40,7);
          auVar290[0] = auVar461[3];
          auVar290._9_6_ = 0;
          auVar291._1_10_ = SUB1510(auVar290 << 0x30,5);
          auVar291[0] = auVar461[2];
          auVar291._11_4_ = 0;
          auVar210[2] = auVar461[1];
          auVar210._0_2_ = auVar461._0_2_;
          auVar210._3_12_ = SUB1512(auVar291 << 0x20,3);
          auVar551._0_2_ = auVar461._0_2_ & 0xff;
          auVar551._2_13_ = auVar210._2_13_;
          auVar551[0xf] = 0;
          auVar552 = pmaddwd(auVar551,auVar331);
          uVar4 = *(ulong *)(puVar313 + lVar306);
          uVar404 = (undefined1)(uVar4 >> 0x38);
          uVar329 = (undefined1)(uVar3 >> 0x38);
          auVar376._8_6_ = 0;
          auVar376._0_8_ = uVar3;
          auVar376[0xe] = uVar329;
          auVar376[0xf] = uVar404;
          auVar375._14_2_ = auVar376._14_2_;
          auVar375._8_5_ = 0;
          auVar375._0_8_ = uVar3;
          uVar403 = (undefined1)(uVar4 >> 0x30);
          auVar375[0xd] = uVar403;
          uVar328 = (undefined1)(uVar3 >> 0x30);
          auVar374._13_3_ = auVar375._13_3_;
          auVar374._8_4_ = 0;
          auVar374._0_8_ = uVar3;
          auVar374[0xc] = uVar328;
          auVar373._12_4_ = auVar374._12_4_;
          auVar373._8_3_ = 0;
          auVar373._0_8_ = uVar3;
          uVar402 = (undefined1)(uVar4 >> 0x28);
          auVar373[0xb] = uVar402;
          uVar327 = (undefined1)(uVar3 >> 0x28);
          auVar372._11_5_ = auVar373._11_5_;
          auVar372._8_2_ = 0;
          auVar372._0_8_ = uVar3;
          auVar372[10] = uVar327;
          auVar371._10_6_ = auVar372._10_6_;
          auVar371[8] = 0;
          auVar371._0_8_ = uVar3;
          bVar401 = (byte)(uVar4 >> 0x20);
          auVar371[9] = bVar401;
          bVar354 = (byte)(uVar3 >> 0x20);
          auVar370._9_7_ = auVar371._9_7_;
          auVar370[8] = bVar354;
          auVar370._0_8_ = uVar3;
          auVar369._8_8_ = auVar370._8_8_;
          uVar400 = (undefined1)(uVar4 >> 0x18);
          auVar369[7] = uVar400;
          uVar326 = (undefined1)(uVar3 >> 0x18);
          auVar369[6] = uVar326;
          uVar343 = (undefined1)(uVar4 >> 0x10);
          auVar369[5] = uVar343;
          uVar325 = (undefined1)(uVar3 >> 0x10);
          auVar369[4] = uVar325;
          uVar330 = (undefined1)(uVar4 >> 8);
          auVar369[3] = uVar330;
          uVar324 = (undefined1)(uVar3 >> 8);
          auVar369[2] = uVar324;
          bVar377 = (byte)uVar4;
          auVar369._0_2_ = CONCAT11(bVar377,(byte)uVar3);
          auVar511[1] = 0;
          auVar511[0] = auVar459[8];
          auVar511[2] = auVar459[9];
          auVar511[3] = 0;
          auVar511[4] = auVar459[10];
          auVar511[5] = 0;
          auVar511[6] = auVar459[0xb];
          auVar511[7] = 0;
          auVar511[8] = auVar459[0xc];
          auVar511[9] = 0;
          auVar511[10] = auVar459[0xd];
          auVar511[0xb] = 0;
          auVar511[0xc] = auVar459[0xe];
          auVar511[0xd] = 0;
          auVar511[0xe] = auVar459[0xf];
          auVar511[0xf] = 0;
          auVar533[1] = 0;
          auVar533[0] = auVar391[8];
          auVar533[2] = auVar391[9];
          auVar533[3] = 0;
          auVar533[4] = auVar391[10];
          auVar533[5] = 0;
          auVar533[6] = auVar391[0xb];
          auVar533[7] = 0;
          auVar533[8] = auVar391[0xc];
          auVar533[9] = 0;
          auVar533[10] = auVar391[0xd];
          auVar533[0xb] = 0;
          auVar533[0xc] = auVar391[0xe];
          auVar533[0xd] = 0;
          auVar533[0xe] = auVar391[0xf];
          auVar533[0xf] = 0;
          auVar529 = pmaddwd(auVar511,auVar340);
          auVar534 = pmaddwd(auVar533,auVar342);
          auVar512[1] = 0;
          auVar512[0] = auVar461[8];
          auVar512[2] = auVar461[9];
          auVar512[3] = 0;
          auVar512[4] = auVar461[10];
          auVar512[5] = 0;
          auVar512[6] = auVar461[0xb];
          auVar512[7] = 0;
          auVar512[8] = auVar461[0xc];
          auVar512[9] = 0;
          auVar512[10] = auVar461[0xd];
          auVar512[0xb] = 0;
          auVar512[0xc] = auVar461[0xe];
          auVar512[0xd] = 0;
          auVar512[0xe] = auVar461[0xf];
          auVar512[0xf] = 0;
          auVar531 = pmaddwd(auVar512,auVar331);
          auVar43[0xd] = 0;
          auVar43._0_13_ = auVar369._0_13_;
          auVar43[0xe] = uVar400;
          auVar71[0xc] = uVar326;
          auVar71._0_12_ = auVar369._0_12_;
          auVar71._13_2_ = auVar43._13_2_;
          auVar99[0xb] = 0;
          auVar99._0_11_ = auVar369._0_11_;
          auVar99._12_3_ = auVar71._12_3_;
          auVar127[10] = uVar343;
          auVar127._0_10_ = auVar369._0_10_;
          auVar127._11_4_ = auVar99._11_4_;
          auVar155[9] = 0;
          auVar155._0_9_ = auVar369._0_9_;
          auVar155._10_5_ = auVar127._10_5_;
          auVar183[8] = uVar325;
          auVar183._0_8_ = auVar369._0_8_;
          auVar183._9_6_ = auVar155._9_6_;
          auVar241._7_8_ = 0;
          auVar241._0_7_ = auVar183._8_7_;
          auVar292._1_8_ = SUB158(auVar241 << 0x40,7);
          auVar292[0] = uVar330;
          auVar292._9_6_ = 0;
          auVar293._1_10_ = SUB1510(auVar292 << 0x30,5);
          auVar293[0] = uVar324;
          auVar293._11_4_ = 0;
          auVar211[2] = bVar377;
          auVar211._0_2_ = auVar369._0_2_;
          auVar211._3_12_ = SUB1512(auVar293 << 0x20,3);
          auVar414[1] = 0;
          auVar414[0] = (byte)uVar3;
          auVar414._2_13_ = auVar211._2_13_;
          auVar414[0xf] = 0;
          auVar459 = pmaddwd(auVar414,auVar358);
          auVar415[1] = 0;
          auVar415[0] = bVar354;
          auVar415[2] = bVar401;
          auVar415[3] = 0;
          auVar415[4] = uVar327;
          auVar415[5] = 0;
          auVar415[6] = uVar402;
          auVar415[7] = 0;
          auVar415[8] = uVar328;
          auVar415[9] = 0;
          auVar415[10] = uVar403;
          auVar415[0xb] = 0;
          auVar415[0xc] = uVar329;
          auVar415[0xd] = 0;
          auVar415[0xe] = uVar404;
          auVar415[0xf] = 0;
          auVar495 = pmaddwd(auVar415,auVar358);
          auVar553._0_4_ =
               auVar552._0_4_ + auVar362._0_4_ + auVar360._0_4_ + 0x40 + auVar459._0_4_ >> 7;
          auVar553._4_4_ =
               auVar552._4_4_ + auVar362._4_4_ + auVar360._4_4_ + 0x40 + auVar459._4_4_ >> 7;
          auVar553._8_4_ =
               auVar552._8_4_ + auVar362._8_4_ + auVar360._8_4_ + 0x40 + auVar459._8_4_ >> 7;
          auVar553._12_4_ =
               auVar552._12_4_ + auVar362._12_4_ + auVar360._12_4_ + 0x40 + auVar459._12_4_ >> 7;
          auVar513._0_4_ =
               auVar531._0_4_ + auVar534._0_4_ + auVar529._0_4_ + 0x40 + auVar495._0_4_ >> 7;
          auVar513._4_4_ =
               auVar531._4_4_ + auVar534._4_4_ + auVar529._4_4_ + 0x40 + auVar495._4_4_ >> 7;
          auVar513._8_4_ =
               auVar531._8_4_ + auVar534._8_4_ + auVar529._8_4_ + 0x40 + auVar495._8_4_ >> 7;
          auVar513._12_4_ =
               auVar531._12_4_ + auVar534._12_4_ + auVar529._12_4_ + 0x40 + auVar495._12_4_ >> 7;
          auVar360 = packssdw(auVar553,auVar513);
          uVar3 = *(ulong *)(puVar313 + lVar310);
          sVar13 = auVar360._0_2_;
          sVar14 = auVar360._2_2_;
          sVar15 = auVar360._4_2_;
          sVar16 = auVar360._6_2_;
          sVar17 = auVar360._8_2_;
          sVar18 = auVar360._10_2_;
          sVar19 = auVar360._12_2_;
          sVar20 = auVar360._14_2_;
          *(ulong *)puVar309 =
               CONCAT17((0 < sVar20) * (sVar20 < 0x100) * auVar360[0xe] - (0xff < sVar20),
                        CONCAT16((0 < sVar19) * (sVar19 < 0x100) * auVar360[0xc] - (0xff < sVar19),
                                 CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar360[10] -
                                          (0xff < sVar18),
                                          CONCAT14((0 < sVar17) * (sVar17 < 0x100) * auVar360[8] -
                                                   (0xff < sVar17),
                                                   CONCAT13((0 < sVar16) * (sVar16 < 0x100) *
                                                            auVar360[6] - (0xff < sVar16),
                                                            CONCAT12((0 < sVar15) * (sVar15 < 0x100)
                                                                     * auVar360[4] - (0xff < sVar15)
                                                                     ,CONCAT11((0 < sVar14) *
                                                                               (sVar14 < 0x100) *
                                                                               auVar360[2] -
                                                                               (0xff < sVar14),
                                                                               (0 < sVar13) *
                                                                               (sVar13 < 0x100) *
                                                                               auVar360[0] -
                                                                               (0xff < sVar13)))))))
                       );
          auVar44[0xd] = 0;
          auVar44._0_13_ = auVar424._0_13_;
          auVar44[0xe] = auVar424[7];
          auVar72[0xc] = auVar424[6];
          auVar72._0_12_ = auVar424._0_12_;
          auVar72._13_2_ = auVar44._13_2_;
          auVar100[0xb] = 0;
          auVar100._0_11_ = auVar424._0_11_;
          auVar100._12_3_ = auVar72._12_3_;
          auVar128[10] = auVar424[5];
          auVar128._0_10_ = auVar424._0_10_;
          auVar128._11_4_ = auVar100._11_4_;
          auVar156[9] = 0;
          auVar156._0_9_ = auVar424._0_9_;
          auVar156._10_5_ = auVar128._10_5_;
          auVar184[8] = auVar424[4];
          auVar184._0_8_ = auVar424._0_8_;
          auVar184._9_6_ = auVar156._9_6_;
          auVar242._7_8_ = 0;
          auVar242._0_7_ = auVar184._8_7_;
          auVar294._1_8_ = SUB158(auVar242 << 0x40,7);
          auVar294[0] = auVar424[3];
          auVar294._9_6_ = 0;
          auVar295._1_10_ = SUB1510(auVar294 << 0x30,5);
          auVar295[0] = auVar424[2];
          auVar295._11_4_ = 0;
          auVar212[2] = auVar424[1];
          auVar212._0_2_ = auVar424._0_2_;
          auVar212._3_12_ = SUB1512(auVar295 << 0x20,3);
          auVar514._0_2_ = auVar424._0_2_ & 0xff;
          auVar514._2_13_ = auVar212._2_13_;
          auVar514[0xf] = 0;
          auVar45[0xd] = 0;
          auVar45._0_13_ = auVar390._0_13_;
          auVar45[0xe] = auVar390[7];
          auVar73[0xc] = auVar390[6];
          auVar73._0_12_ = auVar390._0_12_;
          auVar73._13_2_ = auVar45._13_2_;
          auVar101[0xb] = 0;
          auVar101._0_11_ = auVar390._0_11_;
          auVar101._12_3_ = auVar73._12_3_;
          auVar129[10] = auVar390[5];
          auVar129._0_10_ = auVar390._0_10_;
          auVar129._11_4_ = auVar101._11_4_;
          auVar157[9] = 0;
          auVar157._0_9_ = auVar390._0_9_;
          auVar157._10_5_ = auVar129._10_5_;
          auVar185[8] = auVar390[4];
          auVar185._0_8_ = auVar390._0_8_;
          auVar185._9_6_ = auVar157._9_6_;
          auVar243._7_8_ = 0;
          auVar243._0_7_ = auVar185._8_7_;
          auVar296._1_8_ = SUB158(auVar243 << 0x40,7);
          auVar296[0] = auVar390[3];
          auVar296._9_6_ = 0;
          auVar297._1_10_ = SUB1510(auVar296 << 0x30,5);
          auVar297[0] = auVar390[2];
          auVar297._11_4_ = 0;
          auVar213[2] = auVar390[1];
          auVar213._0_2_ = auVar390._0_2_;
          auVar213._3_12_ = SUB1512(auVar297 << 0x20,3);
          auVar416._0_2_ = auVar390._0_2_ & 0xff;
          auVar416._2_13_ = auVar213._2_13_;
          auVar416[0xf] = 0;
          auVar534 = pmaddwd(auVar514,auVar340);
          auVar362 = pmaddwd(auVar416,auVar342);
          auVar46[0xd] = 0;
          auVar46._0_13_ = auVar422._0_13_;
          auVar46[0xe] = auVar422[7];
          auVar74[0xc] = auVar422[6];
          auVar74._0_12_ = auVar422._0_12_;
          auVar74._13_2_ = auVar46._13_2_;
          auVar102[0xb] = 0;
          auVar102._0_11_ = auVar422._0_11_;
          auVar102._12_3_ = auVar74._12_3_;
          auVar130[10] = auVar422[5];
          auVar130._0_10_ = auVar422._0_10_;
          auVar130._11_4_ = auVar102._11_4_;
          auVar158[9] = 0;
          auVar158._0_9_ = auVar422._0_9_;
          auVar158._10_5_ = auVar130._10_5_;
          auVar186[8] = auVar422[4];
          auVar186._0_8_ = auVar422._0_8_;
          auVar186._9_6_ = auVar158._9_6_;
          auVar244._7_8_ = 0;
          auVar244._0_7_ = auVar186._8_7_;
          auVar298._1_8_ = SUB158(auVar244 << 0x40,7);
          auVar298[0] = auVar422[3];
          auVar298._9_6_ = 0;
          auVar299._1_10_ = SUB1510(auVar298 << 0x30,5);
          auVar299[0] = auVar422[2];
          auVar299._11_4_ = 0;
          auVar214[2] = auVar422[1];
          auVar214._0_2_ = auVar422._0_2_;
          auVar214._3_12_ = SUB1512(auVar299 << 0x20,3);
          auVar515._0_2_ = auVar422._0_2_ & 0xff;
          auVar515._2_13_ = auVar214._2_13_;
          auVar515[0xf] = 0;
          auVar552 = pmaddwd(auVar515,auVar331);
          uVar472 = (undefined1)(uVar3 >> 0x38);
          auVar399._8_6_ = 0;
          auVar399._0_8_ = uVar4;
          auVar399[0xe] = uVar404;
          auVar399[0xf] = uVar472;
          auVar398._14_2_ = auVar399._14_2_;
          auVar398._8_5_ = 0;
          auVar398._0_8_ = uVar4;
          uVar329 = (undefined1)(uVar3 >> 0x30);
          auVar398[0xd] = uVar329;
          auVar397._13_3_ = auVar398._13_3_;
          auVar397._8_4_ = 0;
          auVar397._0_8_ = uVar4;
          auVar397[0xc] = uVar403;
          auVar396._12_4_ = auVar397._12_4_;
          auVar396._8_3_ = 0;
          auVar396._0_8_ = uVar4;
          uVar328 = (undefined1)(uVar3 >> 0x28);
          auVar396[0xb] = uVar328;
          auVar395._11_5_ = auVar396._11_5_;
          auVar395._8_2_ = 0;
          auVar395._0_8_ = uVar4;
          auVar395[10] = uVar402;
          auVar394._10_6_ = auVar395._10_6_;
          auVar394[8] = 0;
          auVar394._0_8_ = uVar4;
          uVar327 = (undefined1)(uVar3 >> 0x20);
          auVar394[9] = uVar327;
          auVar393._9_7_ = auVar394._9_7_;
          auVar393[8] = bVar401;
          auVar393._0_8_ = uVar4;
          auVar360._8_8_ = auVar393._8_8_;
          uVar326 = (undefined1)(uVar3 >> 0x18);
          auVar360[7] = uVar326;
          auVar360[6] = uVar400;
          uVar325 = (undefined1)(uVar3 >> 0x10);
          auVar360[5] = uVar325;
          auVar360[4] = uVar343;
          uVar324 = (undefined1)(uVar3 >> 8);
          auVar360[3] = uVar324;
          auVar360[2] = uVar330;
          auVar360._0_2_ = CONCAT11((char)uVar3,bVar377);
          auVar480[1] = 0;
          auVar480[0] = auVar424[8];
          auVar480[2] = auVar424[9];
          auVar480[3] = 0;
          auVar480[4] = auVar424[10];
          auVar480[5] = 0;
          auVar480[6] = auVar424[0xb];
          auVar480[7] = 0;
          auVar480[8] = auVar424[0xc];
          auVar480[9] = 0;
          auVar480[10] = auVar424[0xd];
          auVar480[0xb] = 0;
          auVar480[0xc] = auVar424[0xe];
          auVar480[0xd] = 0;
          auVar480[0xe] = auVar424[0xf];
          auVar480[0xf] = 0;
          auVar417[1] = 0;
          auVar417[0] = auVar390[8];
          auVar417[2] = auVar390[9];
          auVar417[3] = 0;
          auVar417[4] = auVar390[10];
          auVar417[5] = 0;
          auVar417[6] = auVar390[0xb];
          auVar417[7] = 0;
          auVar417[8] = auVar390[0xc];
          auVar417[9] = 0;
          auVar417[10] = auVar390[0xd];
          auVar417[0xb] = 0;
          auVar417[0xc] = auVar390[0xe];
          auVar417[0xd] = 0;
          auVar417[0xe] = auVar390[0xf];
          auVar417[0xf] = 0;
          auVar529 = pmaddwd(auVar480,auVar340);
          auVar424 = pmaddwd(auVar417,auVar342);
          auVar481[1] = 0;
          auVar481[0] = auVar422[8];
          auVar481[2] = auVar422[9];
          auVar481[3] = 0;
          auVar481[4] = auVar422[10];
          auVar481[5] = 0;
          auVar481[6] = auVar422[0xb];
          auVar481[7] = 0;
          auVar481[8] = auVar422[0xc];
          auVar481[9] = 0;
          auVar481[10] = auVar422[0xd];
          auVar481[0xb] = 0;
          auVar481[0xc] = auVar422[0xe];
          auVar481[0xd] = 0;
          auVar481[0xe] = auVar422[0xf];
          auVar481[0xf] = 0;
          auVar531 = pmaddwd(auVar481,auVar331);
          auVar47[0xd] = 0;
          auVar47._0_13_ = auVar360._0_13_;
          auVar47[0xe] = uVar326;
          auVar75[0xc] = uVar400;
          auVar75._0_12_ = auVar360._0_12_;
          auVar75._13_2_ = auVar47._13_2_;
          auVar103[0xb] = 0;
          auVar103._0_11_ = auVar360._0_11_;
          auVar103._12_3_ = auVar75._12_3_;
          auVar131[10] = uVar325;
          auVar131._0_10_ = auVar360._0_10_;
          auVar131._11_4_ = auVar103._11_4_;
          auVar159[9] = 0;
          auVar159._0_9_ = auVar360._0_9_;
          auVar159._10_5_ = auVar131._10_5_;
          auVar187[8] = uVar343;
          auVar187._0_8_ = auVar360._0_8_;
          auVar187._9_6_ = auVar159._9_6_;
          auVar245._7_8_ = 0;
          auVar245._0_7_ = auVar187._8_7_;
          auVar300._1_8_ = SUB158(auVar245 << 0x40,7);
          auVar300[0] = uVar324;
          auVar300._9_6_ = 0;
          auVar301._1_10_ = SUB1510(auVar300 << 0x30,5);
          auVar301[0] = uVar330;
          auVar301._11_4_ = 0;
          auVar215[2] = (char)uVar3;
          auVar215._0_2_ = auVar360._0_2_;
          auVar215._3_12_ = SUB1512(auVar301 << 0x20,3);
          auVar418[1] = 0;
          auVar418[0] = bVar377;
          auVar418._2_13_ = auVar215._2_13_;
          auVar418[0xf] = 0;
          auVar459 = pmaddwd(auVar418,auVar358);
          auVar419[1] = 0;
          auVar419[0] = bVar401;
          auVar419[2] = uVar327;
          auVar419[3] = 0;
          auVar419[4] = uVar402;
          auVar419[5] = 0;
          auVar419[6] = uVar328;
          auVar419[7] = 0;
          auVar419[8] = uVar403;
          auVar419[9] = 0;
          auVar419[10] = uVar329;
          auVar419[0xb] = 0;
          auVar419[0xc] = uVar404;
          auVar419[0xd] = 0;
          auVar419[0xe] = uVar472;
          auVar419[0xf] = 0;
          auVar495 = pmaddwd(auVar419,auVar358);
          auVar516._0_4_ =
               auVar552._0_4_ + auVar362._0_4_ + auVar534._0_4_ + 0x40 + auVar459._0_4_ >> 7;
          auVar516._4_4_ =
               auVar552._4_4_ + auVar362._4_4_ + auVar534._4_4_ + 0x40 + auVar459._4_4_ >> 7;
          auVar516._8_4_ =
               auVar552._8_4_ + auVar362._8_4_ + auVar534._8_4_ + 0x40 + auVar459._8_4_ >> 7;
          auVar516._12_4_ =
               auVar552._12_4_ + auVar362._12_4_ + auVar534._12_4_ + 0x40 + auVar459._12_4_ >> 7;
          auVar482._0_4_ =
               auVar531._0_4_ + auVar424._0_4_ + auVar529._0_4_ + 0x40 + auVar495._0_4_ >> 7;
          auVar482._4_4_ =
               auVar531._4_4_ + auVar424._4_4_ + auVar529._4_4_ + 0x40 + auVar495._4_4_ >> 7;
          auVar482._8_4_ =
               auVar531._8_4_ + auVar424._8_4_ + auVar529._8_4_ + 0x40 + auVar495._8_4_ >> 7;
          auVar482._12_4_ =
               auVar531._12_4_ + auVar424._12_4_ + auVar529._12_4_ + 0x40 + auVar495._12_4_ >> 7;
          auVar362 = packssdw(auVar516,auVar482);
          sVar13 = auVar362._0_2_;
          sVar14 = auVar362._2_2_;
          sVar15 = auVar362._4_2_;
          sVar16 = auVar362._6_2_;
          sVar17 = auVar362._8_2_;
          sVar18 = auVar362._10_2_;
          sVar19 = auVar362._12_2_;
          sVar20 = auVar362._14_2_;
          *(ulong *)(puVar309 + dst_stride) =
               CONCAT17((0 < sVar20) * (sVar20 < 0x100) * auVar362[0xe] - (0xff < sVar20),
                        CONCAT16((0 < sVar19) * (sVar19 < 0x100) * auVar362[0xc] - (0xff < sVar19),
                                 CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar362[10] -
                                          (0xff < sVar18),
                                          CONCAT14((0 < sVar17) * (sVar17 < 0x100) * auVar362[8] -
                                                   (0xff < sVar17),
                                                   CONCAT13((0 < sVar16) * (sVar16 < 0x100) *
                                                            auVar362[6] - (0xff < sVar16),
                                                            CONCAT12((0 < sVar15) * (sVar15 < 0x100)
                                                                     * auVar362[4] - (0xff < sVar15)
                                                                     ,CONCAT11((0 < sVar14) *
                                                                               (sVar14 < 0x100) *
                                                                               auVar362[2] -
                                                                               (0xff < sVar14),
                                                                               (0 < sVar13) *
                                                                               (sVar13 < 0x100) *
                                                                               auVar362[0] -
                                                                               (0xff < sVar13)))))))
                       );
          lVar312 = lVar312 + 2;
          puVar309 = puVar309 + (long)dst_stride * 2;
          puVar313 = puVar313 + lVar308 * 2;
          auVar362 = auVar461;
          auVar424 = auVar390;
          auVar459 = auVar391;
          auVar461 = auVar369;
        } while (lVar312 < h);
        uVar314 = uVar314 + 8;
        dst = dst + 8;
        lVar310 = lVar310 + 8;
        lVar306 = lVar306 + 8;
      } while (uVar314 < (uint)w);
    }
  }
  else {
    if (w < 8) {
      av1_convolve_y_sr_c(src,src_stride,dst,dst_stride,w,h,filter_params_y,subpel_y_qn);
      return;
    }
    lVar306 = (long)(int)(((uVar6 >> 1) - 1) * src_stride);
    uVar314 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar6);
    piVar1 = filter_params_y->filter_ptr + uVar314;
    uVar315 = *(undefined4 *)piVar1;
    uVar7 = *(undefined4 *)(piVar1 + 2);
    uVar8 = *(undefined4 *)(piVar1 + 4);
    uVar9 = *(undefined4 *)(piVar1 + 6);
    auVar356._4_4_ = uVar315;
    auVar356._0_4_ = uVar315;
    auVar356._8_4_ = uVar315;
    auVar356._12_4_ = uVar315;
    auVar368._4_4_ = uVar7;
    auVar368._0_4_ = uVar7;
    auVar368._8_4_ = uVar7;
    auVar368._12_4_ = uVar7;
    uVar2 = *(undefined8 *)(filter_params_y->filter_ptr + uVar314 + 8);
    uVar315 = (undefined4)uVar2;
    local_108._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    auVar420._4_4_ = uVar315;
    auVar420._0_4_ = uVar315;
    auVar420._8_4_ = uVar315;
    auVar420._12_4_ = uVar315;
    lVar312 = (long)src_stride;
    lVar308 = src_stride * 0xb - lVar306;
    lVar310 = src_stride * 0xc - lVar306;
    uVar314 = 0;
    local_108._0_4_ = local_108._4_4_;
    local_108._8_4_ = local_108._4_4_;
    local_108._12_4_ = local_108._4_4_;
    do {
      lVar311 = uVar314 - lVar306;
      uVar3 = *(ulong *)(src + lVar312 * 10 + lVar311);
      uVar4 = *(ulong *)(src + (uVar314 - lVar306));
      uVar5 = *(ulong *)(src + lVar312 + lVar311);
      uVar330 = (undefined1)(uVar5 >> 0x38);
      auVar527._8_6_ = 0;
      auVar527._0_8_ = uVar4;
      auVar527[0xe] = (char)(uVar4 >> 0x38);
      auVar527[0xf] = uVar330;
      uVar329 = (undefined1)(uVar5 >> 0x30);
      auVar526._14_2_ = auVar527._14_2_;
      auVar526._8_5_ = 0;
      auVar526._0_8_ = uVar4;
      auVar526[0xd] = uVar329;
      auVar525._13_3_ = auVar526._13_3_;
      auVar525._8_4_ = 0;
      auVar525._0_8_ = uVar4;
      auVar525[0xc] = (char)(uVar4 >> 0x30);
      uVar328 = (undefined1)(uVar5 >> 0x28);
      auVar524._12_4_ = auVar525._12_4_;
      auVar524._8_3_ = 0;
      auVar524._0_8_ = uVar4;
      auVar524[0xb] = uVar328;
      auVar523._11_5_ = auVar524._11_5_;
      auVar523._8_2_ = 0;
      auVar523._0_8_ = uVar4;
      auVar523[10] = (char)(uVar4 >> 0x28);
      uVar327 = (undefined1)(uVar5 >> 0x20);
      auVar522._10_6_ = auVar523._10_6_;
      auVar522[8] = 0;
      auVar522._0_8_ = uVar4;
      auVar522[9] = uVar327;
      auVar521._9_7_ = auVar522._9_7_;
      auVar521[8] = (char)(uVar4 >> 0x20);
      auVar521._0_8_ = uVar4;
      uVar326 = (undefined1)(uVar5 >> 0x18);
      auVar520._8_8_ = auVar521._8_8_;
      auVar520[7] = uVar326;
      auVar520[6] = (char)(uVar4 >> 0x18);
      uVar325 = (undefined1)(uVar5 >> 0x10);
      auVar520[5] = uVar325;
      auVar520[4] = (char)(uVar4 >> 0x10);
      uVar324 = (undefined1)(uVar5 >> 8);
      auVar520[3] = uVar324;
      auVar520[2] = (char)(uVar4 >> 8);
      auVar378[0] = (undefined1)uVar5;
      auVar520[0] = (undefined1)uVar4;
      auVar520[1] = auVar378[0];
      uVar4 = *(ulong *)(src + lVar312 * 2 + lVar311);
      uVar343 = (undefined1)(uVar4 >> 0x38);
      auVar385._8_6_ = 0;
      auVar385._0_8_ = uVar5;
      auVar385[0xe] = uVar330;
      auVar385[0xf] = uVar343;
      auVar384._14_2_ = auVar385._14_2_;
      auVar384._8_5_ = 0;
      auVar384._0_8_ = uVar5;
      uVar330 = (undefined1)(uVar4 >> 0x30);
      auVar384[0xd] = uVar330;
      auVar383._13_3_ = auVar384._13_3_;
      auVar383._8_4_ = 0;
      auVar383._0_8_ = uVar5;
      auVar383[0xc] = uVar329;
      auVar382._12_4_ = auVar383._12_4_;
      auVar382._8_3_ = 0;
      auVar382._0_8_ = uVar5;
      uVar329 = (undefined1)(uVar4 >> 0x28);
      auVar382[0xb] = uVar329;
      auVar381._11_5_ = auVar382._11_5_;
      auVar381._8_2_ = 0;
      auVar381._0_8_ = uVar5;
      auVar381[10] = uVar328;
      auVar380._10_6_ = auVar381._10_6_;
      auVar380[8] = 0;
      auVar380._0_8_ = uVar5;
      uVar328 = (undefined1)(uVar4 >> 0x20);
      auVar380[9] = uVar328;
      auVar379._9_7_ = auVar380._9_7_;
      auVar379[8] = uVar327;
      auVar379._0_8_ = uVar5;
      auVar378._8_8_ = auVar379._8_8_;
      uVar327 = (undefined1)(uVar4 >> 0x18);
      auVar378[7] = uVar327;
      auVar378[6] = uVar326;
      uVar326 = (undefined1)(uVar4 >> 0x10);
      auVar378[5] = uVar326;
      auVar378[4] = uVar325;
      uVar325 = (undefined1)(uVar4 >> 8);
      auVar378[3] = uVar325;
      auVar378[2] = uVar324;
      auVar436[0] = (undefined1)uVar4;
      auVar378[1] = auVar436[0];
      uVar5 = *(ulong *)(src + lVar312 * 3 + lVar311);
      uVar472 = (undefined1)(uVar5 >> 0x38);
      auVar443._8_6_ = 0;
      auVar443._0_8_ = uVar4;
      auVar443[0xe] = uVar343;
      auVar443[0xf] = uVar472;
      auVar442._14_2_ = auVar443._14_2_;
      auVar442._8_5_ = 0;
      auVar442._0_8_ = uVar4;
      uVar404 = (undefined1)(uVar5 >> 0x30);
      auVar442[0xd] = uVar404;
      auVar441._13_3_ = auVar442._13_3_;
      auVar441._8_4_ = 0;
      auVar441._0_8_ = uVar4;
      auVar441[0xc] = uVar330;
      auVar440._12_4_ = auVar441._12_4_;
      auVar440._8_3_ = 0;
      auVar440._0_8_ = uVar4;
      uVar403 = (undefined1)(uVar5 >> 0x28);
      auVar440[0xb] = uVar403;
      auVar439._11_5_ = auVar440._11_5_;
      auVar439._8_2_ = 0;
      auVar439._0_8_ = uVar4;
      auVar439[10] = uVar329;
      auVar438._10_6_ = auVar439._10_6_;
      auVar438[8] = 0;
      auVar438._0_8_ = uVar4;
      uVar402 = (undefined1)(uVar5 >> 0x20);
      auVar438[9] = uVar402;
      auVar437._9_7_ = auVar438._9_7_;
      auVar437[8] = uVar328;
      auVar437._0_8_ = uVar4;
      auVar436._8_8_ = auVar437._8_8_;
      uVar400 = (undefined1)(uVar5 >> 0x18);
      auVar436[7] = uVar400;
      auVar436[6] = uVar327;
      uVar324 = (undefined1)(uVar5 >> 0x10);
      auVar436[5] = uVar324;
      auVar436[4] = uVar326;
      uVar343 = (undefined1)(uVar5 >> 8);
      auVar436[3] = uVar343;
      auVar436[2] = uVar325;
      auVar536[0] = (undefined1)uVar5;
      auVar436[1] = auVar536[0];
      uVar4 = *(ulong *)(src + lVar312 * 4 + lVar311);
      uVar330 = (undefined1)(uVar4 >> 0x38);
      auVar543._8_6_ = 0;
      auVar543._0_8_ = uVar5;
      auVar543[0xe] = uVar472;
      auVar543[0xf] = uVar330;
      uVar329 = (undefined1)(uVar4 >> 0x30);
      auVar542._14_2_ = auVar543._14_2_;
      auVar542._8_5_ = 0;
      auVar542._0_8_ = uVar5;
      auVar542[0xd] = uVar329;
      auVar541._13_3_ = auVar542._13_3_;
      auVar541._8_4_ = 0;
      auVar541._0_8_ = uVar5;
      auVar541[0xc] = uVar404;
      uVar328 = (undefined1)(uVar4 >> 0x28);
      auVar540._12_4_ = auVar541._12_4_;
      auVar540._8_3_ = 0;
      auVar540._0_8_ = uVar5;
      auVar540[0xb] = uVar328;
      auVar539._11_5_ = auVar540._11_5_;
      auVar539._8_2_ = 0;
      auVar539._0_8_ = uVar5;
      auVar539[10] = uVar403;
      uVar327 = (undefined1)(uVar4 >> 0x20);
      auVar538._10_6_ = auVar539._10_6_;
      auVar538[8] = 0;
      auVar538._0_8_ = uVar5;
      auVar538[9] = uVar327;
      auVar537._9_7_ = auVar538._9_7_;
      auVar537[8] = uVar402;
      auVar537._0_8_ = uVar5;
      uVar326 = (undefined1)(uVar4 >> 0x18);
      auVar536._8_8_ = auVar537._8_8_;
      auVar536[7] = uVar326;
      auVar536[6] = uVar400;
      uVar325 = (undefined1)(uVar4 >> 0x10);
      auVar536[5] = uVar325;
      auVar536[4] = uVar324;
      uVar324 = (undefined1)(uVar4 >> 8);
      auVar536[3] = uVar324;
      auVar536[2] = uVar343;
      auVar316[0] = (undefined1)uVar4;
      auVar536[1] = auVar316[0];
      uVar5 = *(ulong *)(src + lVar312 * 5 + lVar311);
      uVar343 = (undefined1)(uVar5 >> 0x38);
      auVar323._8_6_ = 0;
      auVar323._0_8_ = uVar4;
      auVar323[0xe] = uVar330;
      auVar323[0xf] = uVar343;
      auVar322._14_2_ = auVar323._14_2_;
      auVar322._8_5_ = 0;
      auVar322._0_8_ = uVar4;
      uVar330 = (undefined1)(uVar5 >> 0x30);
      auVar322[0xd] = uVar330;
      auVar321._13_3_ = auVar322._13_3_;
      auVar321._8_4_ = 0;
      auVar321._0_8_ = uVar4;
      auVar321[0xc] = uVar329;
      auVar320._12_4_ = auVar321._12_4_;
      auVar320._8_3_ = 0;
      auVar320._0_8_ = uVar4;
      uVar329 = (undefined1)(uVar5 >> 0x28);
      auVar320[0xb] = uVar329;
      auVar319._11_5_ = auVar320._11_5_;
      auVar319._8_2_ = 0;
      auVar319._0_8_ = uVar4;
      auVar319[10] = uVar328;
      auVar318._10_6_ = auVar319._10_6_;
      auVar318[8] = 0;
      auVar318._0_8_ = uVar4;
      uVar328 = (undefined1)(uVar5 >> 0x20);
      auVar318[9] = uVar328;
      auVar317._9_7_ = auVar318._9_7_;
      auVar317[8] = uVar327;
      auVar317._0_8_ = uVar4;
      auVar316._8_8_ = auVar317._8_8_;
      uVar327 = (undefined1)(uVar5 >> 0x18);
      auVar316[7] = uVar327;
      auVar316[6] = uVar326;
      uVar326 = (undefined1)(uVar5 >> 0x10);
      auVar316[5] = uVar326;
      auVar316[4] = uVar325;
      uVar325 = (undefined1)(uVar5 >> 8);
      auVar316[3] = uVar325;
      auVar316[2] = uVar324;
      local_e8[0] = (undefined1)uVar5;
      auVar316[1] = local_e8[0];
      uVar4 = *(ulong *)(src + lVar312 * 6 + lVar311);
      uVar472 = (undefined1)(uVar4 >> 0x38);
      auVar338._8_6_ = 0;
      auVar338._0_8_ = uVar5;
      auVar338[0xe] = uVar343;
      auVar338[0xf] = uVar472;
      auVar337._14_2_ = auVar338._14_2_;
      auVar337._8_5_ = 0;
      auVar337._0_8_ = uVar5;
      uVar404 = (undefined1)(uVar4 >> 0x30);
      auVar337[0xd] = uVar404;
      auVar336._13_3_ = auVar337._13_3_;
      auVar336._8_4_ = 0;
      auVar336._0_8_ = uVar5;
      auVar336[0xc] = uVar330;
      auVar335._12_4_ = auVar336._12_4_;
      auVar335._8_3_ = 0;
      auVar335._0_8_ = uVar5;
      uVar403 = (undefined1)(uVar4 >> 0x28);
      auVar335[0xb] = uVar403;
      auVar334._11_5_ = auVar335._11_5_;
      auVar334._8_2_ = 0;
      auVar334._0_8_ = uVar5;
      auVar334[10] = uVar329;
      auVar333._10_6_ = auVar334._10_6_;
      auVar333[8] = 0;
      auVar333._0_8_ = uVar5;
      uVar402 = (undefined1)(uVar4 >> 0x20);
      auVar333[9] = uVar402;
      auVar332._9_7_ = auVar333._9_7_;
      auVar332[8] = uVar328;
      auVar332._0_8_ = uVar5;
      local_e8._8_8_ = auVar332._8_8_;
      uVar400 = (undefined1)(uVar4 >> 0x18);
      local_e8[7] = uVar400;
      local_e8[6] = uVar327;
      uVar324 = (undefined1)(uVar4 >> 0x10);
      local_e8[5] = uVar324;
      local_e8[4] = uVar326;
      uVar343 = (undefined1)(uVar4 >> 8);
      local_e8[3] = uVar343;
      local_e8[2] = uVar325;
      local_f8[0] = (undefined1)uVar4;
      local_e8[1] = local_f8[0];
      uVar5 = *(ulong *)(src + lVar312 * 7 + lVar311);
      uVar330 = (undefined1)(uVar5 >> 0x38);
      auVar450._8_6_ = 0;
      auVar450._0_8_ = uVar4;
      auVar450[0xe] = uVar472;
      auVar450[0xf] = uVar330;
      uVar329 = (undefined1)(uVar5 >> 0x30);
      auVar449._14_2_ = auVar450._14_2_;
      auVar449._8_5_ = 0;
      auVar449._0_8_ = uVar4;
      auVar449[0xd] = uVar329;
      auVar448._13_3_ = auVar449._13_3_;
      auVar448._8_4_ = 0;
      auVar448._0_8_ = uVar4;
      auVar448[0xc] = uVar404;
      uVar328 = (undefined1)(uVar5 >> 0x28);
      auVar447._12_4_ = auVar448._12_4_;
      auVar447._8_3_ = 0;
      auVar447._0_8_ = uVar4;
      auVar447[0xb] = uVar328;
      auVar446._11_5_ = auVar447._11_5_;
      auVar446._8_2_ = 0;
      auVar446._0_8_ = uVar4;
      auVar446[10] = uVar403;
      uVar327 = (undefined1)(uVar5 >> 0x20);
      auVar445._10_6_ = auVar446._10_6_;
      auVar445[8] = 0;
      auVar445._0_8_ = uVar4;
      auVar445[9] = uVar327;
      auVar444._9_7_ = auVar445._9_7_;
      auVar444[8] = uVar402;
      auVar444._0_8_ = uVar4;
      uVar326 = (undefined1)(uVar5 >> 0x18);
      local_f8._8_8_ = auVar444._8_8_;
      local_f8[7] = uVar326;
      local_f8[6] = uVar400;
      uVar325 = (undefined1)(uVar5 >> 0x10);
      local_f8[5] = uVar325;
      local_f8[4] = uVar324;
      uVar324 = (undefined1)(uVar5 >> 8);
      local_f8[3] = uVar324;
      local_f8[2] = uVar343;
      auVar346[0] = (undefined1)uVar5;
      local_f8[1] = auVar346[0];
      uVar4 = *(ulong *)(src + lVar312 * 8 + lVar311);
      uVar343 = (undefined1)(uVar4 >> 0x38);
      auVar353._8_6_ = 0;
      auVar353._0_8_ = uVar5;
      auVar353[0xe] = uVar330;
      auVar353[0xf] = uVar343;
      auVar352._14_2_ = auVar353._14_2_;
      auVar352._8_5_ = 0;
      auVar352._0_8_ = uVar5;
      uVar330 = (undefined1)(uVar4 >> 0x30);
      auVar352[0xd] = uVar330;
      auVar351._13_3_ = auVar352._13_3_;
      auVar351._8_4_ = 0;
      auVar351._0_8_ = uVar5;
      auVar351[0xc] = uVar329;
      auVar350._12_4_ = auVar351._12_4_;
      auVar350._8_3_ = 0;
      auVar350._0_8_ = uVar5;
      uVar329 = (undefined1)(uVar4 >> 0x28);
      auVar350[0xb] = uVar329;
      auVar349._11_5_ = auVar350._11_5_;
      auVar349._8_2_ = 0;
      auVar349._0_8_ = uVar5;
      auVar349[10] = uVar328;
      auVar348._10_6_ = auVar349._10_6_;
      auVar348[8] = 0;
      auVar348._0_8_ = uVar5;
      uVar328 = (undefined1)(uVar4 >> 0x20);
      auVar348[9] = uVar328;
      auVar347._9_7_ = auVar348._9_7_;
      auVar347[8] = uVar327;
      auVar347._0_8_ = uVar5;
      auVar346._8_8_ = auVar347._8_8_;
      uVar327 = (undefined1)(uVar4 >> 0x18);
      auVar346[7] = uVar327;
      auVar346[6] = uVar326;
      uVar326 = (undefined1)(uVar4 >> 0x10);
      auVar346[5] = uVar326;
      auVar346[4] = uVar325;
      uVar325 = (undefined1)(uVar4 >> 8);
      auVar346[3] = uVar325;
      auVar346[2] = uVar324;
      auVar405[0] = (undefined1)uVar4;
      auVar346[1] = auVar405[0];
      uVar5 = *(ulong *)(src + lVar312 * 9 + lVar311);
      uVar400 = (undefined1)(uVar5 >> 0x38);
      auVar457._8_6_ = 0;
      auVar457._0_8_ = uVar4;
      auVar457[0xe] = uVar343;
      auVar457[0xf] = uVar400;
      auVar456._14_2_ = auVar457._14_2_;
      auVar456._8_5_ = 0;
      auVar456._0_8_ = uVar4;
      uVar343 = (undefined1)(uVar5 >> 0x30);
      auVar456[0xd] = uVar343;
      auVar455._13_3_ = auVar456._13_3_;
      auVar455._8_4_ = 0;
      auVar455._0_8_ = uVar4;
      auVar455[0xc] = uVar330;
      auVar454._12_4_ = auVar455._12_4_;
      auVar454._8_3_ = 0;
      auVar454._0_8_ = uVar4;
      uVar330 = (undefined1)(uVar5 >> 0x28);
      auVar454[0xb] = uVar330;
      auVar453._11_5_ = auVar454._11_5_;
      auVar453._8_2_ = 0;
      auVar453._0_8_ = uVar4;
      auVar453[10] = uVar329;
      auVar452._10_6_ = auVar453._10_6_;
      auVar452[8] = 0;
      auVar452._0_8_ = uVar4;
      uVar329 = (undefined1)(uVar5 >> 0x20);
      auVar452[9] = uVar329;
      auVar451._9_7_ = auVar452._9_7_;
      auVar451[8] = uVar328;
      auVar451._0_8_ = uVar4;
      auVar405._8_8_ = auVar451._8_8_;
      uVar328 = (undefined1)(uVar5 >> 0x18);
      auVar405[7] = uVar328;
      auVar405[6] = uVar327;
      uVar327 = (undefined1)(uVar5 >> 0x10);
      auVar405[5] = uVar327;
      auVar405[4] = uVar326;
      uVar324 = (undefined1)(uVar5 >> 8);
      auVar405[3] = uVar324;
      auVar405[2] = uVar325;
      auVar486[0] = (undefined1)uVar5;
      auVar405[1] = auVar486[0];
      auVar493._8_6_ = 0;
      auVar493._0_8_ = uVar5;
      auVar493[0xe] = uVar400;
      auVar493[0xf] = (char)(uVar3 >> 0x38);
      auVar492._14_2_ = auVar493._14_2_;
      auVar492._8_5_ = 0;
      auVar492._0_8_ = uVar5;
      auVar492[0xd] = (char)(uVar3 >> 0x30);
      auVar491._13_3_ = auVar492._13_3_;
      auVar491._8_4_ = 0;
      auVar491._0_8_ = uVar5;
      auVar491[0xc] = uVar343;
      auVar490._12_4_ = auVar491._12_4_;
      auVar490._8_3_ = 0;
      auVar490._0_8_ = uVar5;
      auVar490[0xb] = (char)(uVar3 >> 0x28);
      auVar489._11_5_ = auVar490._11_5_;
      auVar489._8_2_ = 0;
      auVar489._0_8_ = uVar5;
      auVar489[10] = uVar330;
      auVar488._10_6_ = auVar489._10_6_;
      auVar488[8] = 0;
      auVar488._0_8_ = uVar5;
      auVar488[9] = (char)(uVar3 >> 0x20);
      auVar487._9_7_ = auVar488._9_7_;
      auVar487[8] = uVar329;
      auVar487._0_8_ = uVar5;
      auVar486._8_8_ = auVar487._8_8_;
      auVar486[7] = (char)(uVar3 >> 0x18);
      auVar486[6] = uVar328;
      auVar486[5] = (char)(uVar3 >> 0x10);
      auVar486[4] = uVar327;
      auVar486[3] = (char)(uVar3 >> 8);
      auVar486[2] = uVar324;
      auVar486[1] = (char)uVar3;
      lVar311 = 0;
      puVar307 = dst;
      puVar309 = src;
      do {
        auVar390 = auVar405;
        auVar391 = auVar436;
        auVar331 = auVar346;
        auVar436 = auVar316;
        auVar28[0xd] = 0;
        auVar28._0_13_ = auVar520._0_13_;
        auVar28[0xe] = auVar520[7];
        auVar56[0xc] = auVar520[6];
        auVar56._0_12_ = auVar520._0_12_;
        auVar56._13_2_ = auVar28._13_2_;
        auVar84[0xb] = 0;
        auVar84._0_11_ = auVar520._0_11_;
        auVar84._12_3_ = auVar56._12_3_;
        auVar112[10] = auVar520[5];
        auVar112._0_10_ = auVar520._0_10_;
        auVar112._11_4_ = auVar84._11_4_;
        auVar140[9] = 0;
        auVar140._0_9_ = auVar520._0_9_;
        auVar140._10_5_ = auVar112._10_5_;
        auVar168[8] = auVar520[4];
        auVar168._0_8_ = auVar520._0_8_;
        auVar168._9_6_ = auVar140._9_6_;
        auVar226._7_8_ = 0;
        auVar226._0_7_ = auVar168._8_7_;
        auVar262._1_8_ = SUB158(auVar226 << 0x40,7);
        auVar262[0] = auVar520[3];
        auVar262._9_6_ = 0;
        auVar263._1_10_ = SUB1510(auVar262 << 0x30,5);
        auVar263[0] = auVar520[2];
        auVar263._11_4_ = 0;
        auVar196[2] = auVar520[1];
        auVar196._0_2_ = auVar520._0_2_;
        auVar196._3_12_ = SUB1512(auVar263 << 0x20,3);
        auVar458._0_2_ = auVar520._0_2_ & 0xff;
        auVar458._2_13_ = auVar196._2_13_;
        auVar458[0xf] = 0;
        auVar29[0xd] = 0;
        auVar29._0_13_ = auVar391._0_13_;
        auVar29[0xe] = auVar391[7];
        auVar57[0xc] = auVar391[6];
        auVar57._0_12_ = auVar391._0_12_;
        auVar57._13_2_ = auVar29._13_2_;
        auVar85[0xb] = 0;
        auVar85._0_11_ = auVar391._0_11_;
        auVar85._12_3_ = auVar57._12_3_;
        auVar113[10] = auVar391[5];
        auVar113._0_10_ = auVar391._0_10_;
        auVar113._11_4_ = auVar85._11_4_;
        auVar141[9] = 0;
        auVar141._0_9_ = auVar391._0_9_;
        auVar141._10_5_ = auVar113._10_5_;
        auVar169[8] = auVar391[4];
        auVar169._0_8_ = auVar391._0_8_;
        auVar169._9_6_ = auVar141._9_6_;
        auVar227._7_8_ = 0;
        auVar227._0_7_ = auVar169._8_7_;
        auVar264._1_8_ = SUB158(auVar227 << 0x40,7);
        auVar264[0] = auVar391[3];
        auVar264._9_6_ = 0;
        auVar265._1_10_ = SUB1510(auVar264 << 0x30,5);
        auVar265[0] = auVar391[2];
        auVar265._11_4_ = 0;
        auVar197[2] = auVar391[1];
        auVar197._0_2_ = auVar391._0_2_;
        auVar197._3_12_ = SUB1512(auVar265 << 0x20,3);
        auVar421._0_2_ = auVar391._0_2_ & 0xff;
        auVar421._2_13_ = auVar197._2_13_;
        auVar421[0xf] = 0;
        auVar30[0xd] = 0;
        auVar30._0_13_ = auVar436._0_13_;
        auVar30[0xe] = auVar436[7];
        auVar58[0xc] = auVar436[6];
        auVar58._0_12_ = auVar436._0_12_;
        auVar58._13_2_ = auVar30._13_2_;
        auVar86[0xb] = 0;
        auVar86._0_11_ = auVar436._0_11_;
        auVar86._12_3_ = auVar58._12_3_;
        auVar114[10] = auVar436[5];
        auVar114._0_10_ = auVar436._0_10_;
        auVar114._11_4_ = auVar86._11_4_;
        auVar142[9] = 0;
        auVar142._0_9_ = auVar436._0_9_;
        auVar142._10_5_ = auVar114._10_5_;
        auVar170[8] = auVar436[4];
        auVar170._0_8_ = auVar436._0_8_;
        auVar170._9_6_ = auVar142._9_6_;
        auVar228._7_8_ = 0;
        auVar228._0_7_ = auVar170._8_7_;
        auVar266._1_8_ = SUB158(auVar228 << 0x40,7);
        auVar266[0] = auVar436[3];
        auVar266._9_6_ = 0;
        auVar267._1_10_ = SUB1510(auVar266 << 0x30,5);
        auVar267[0] = auVar436[2];
        auVar267._11_4_ = 0;
        auVar198[2] = auVar436[1];
        auVar198._0_2_ = auVar436._0_2_;
        auVar198._3_12_ = SUB1512(auVar267 << 0x20,3);
        auVar494._0_2_ = auVar436._0_2_ & 0xff;
        auVar494._2_13_ = auVar198._2_13_;
        auVar494[0xf] = 0;
        auVar459 = pmaddwd(auVar458,auVar356);
        auVar422 = pmaddwd(auVar421,auVar368);
        auVar31[0xd] = 0;
        auVar31._0_13_ = local_f8._0_13_;
        auVar31[0xe] = local_f8[7];
        auVar59[0xc] = local_f8[6];
        auVar59._0_12_ = local_f8._0_12_;
        auVar59._13_2_ = auVar31._13_2_;
        auVar87[0xb] = 0;
        auVar87._0_11_ = local_f8._0_11_;
        auVar87._12_3_ = auVar59._12_3_;
        auVar115[10] = local_f8[5];
        auVar115._0_10_ = local_f8._0_10_;
        auVar115._11_4_ = auVar87._11_4_;
        auVar143[9] = 0;
        auVar143._0_9_ = local_f8._0_9_;
        auVar143._10_5_ = auVar115._10_5_;
        auVar171[8] = local_f8[4];
        auVar171._0_8_ = local_f8._0_8_;
        auVar171._9_6_ = auVar143._9_6_;
        auVar229._7_8_ = 0;
        auVar229._0_7_ = auVar171._8_7_;
        auVar268._1_8_ = SUB158(auVar229 << 0x40,7);
        auVar268[0] = local_f8[3];
        auVar268._9_6_ = 0;
        auVar269._1_10_ = SUB1510(auVar268 << 0x30,5);
        auVar269[0] = local_f8[2];
        auVar269._11_4_ = 0;
        auVar199[2] = local_f8[1];
        auVar199._0_2_ = local_f8._0_2_;
        auVar199._3_12_ = SUB1512(auVar269 << 0x20,3);
        auVar357._0_2_ = local_f8._0_2_ & 0xff;
        auVar357._2_13_ = auVar199._2_13_;
        auVar357[0xf] = 0;
        auVar217._4_4_ = uVar8;
        auVar217._0_4_ = uVar8;
        auVar217._8_4_ = uVar8;
        auVar217._12_4_ = uVar8;
        auVar495 = pmaddwd(auVar494,auVar217);
        auVar216._4_4_ = uVar9;
        auVar216._0_4_ = uVar9;
        auVar216._8_4_ = uVar9;
        auVar216._12_4_ = uVar9;
        auVar358 = pmaddwd(auVar357,auVar216);
        uVar4 = *(ulong *)(puVar309 + lVar308);
        uVar472 = (undefined1)(uVar4 >> 0x38);
        uVar329 = (undefined1)(uVar3 >> 0x38);
        auVar412._8_6_ = 0;
        auVar412._0_8_ = uVar3;
        auVar412[0xe] = uVar329;
        auVar412[0xf] = uVar472;
        auVar411._14_2_ = auVar412._14_2_;
        auVar411._8_5_ = 0;
        auVar411._0_8_ = uVar3;
        uVar404 = (undefined1)(uVar4 >> 0x30);
        auVar411[0xd] = uVar404;
        uVar328 = (undefined1)(uVar3 >> 0x30);
        auVar410._13_3_ = auVar411._13_3_;
        auVar410._8_4_ = 0;
        auVar410._0_8_ = uVar3;
        auVar410[0xc] = uVar328;
        auVar409._12_4_ = auVar410._12_4_;
        auVar409._8_3_ = 0;
        auVar409._0_8_ = uVar3;
        uVar403 = (undefined1)(uVar4 >> 0x28);
        auVar409[0xb] = uVar403;
        uVar327 = (undefined1)(uVar3 >> 0x28);
        auVar408._11_5_ = auVar409._11_5_;
        auVar408._8_2_ = 0;
        auVar408._0_8_ = uVar3;
        auVar408[10] = uVar327;
        auVar407._10_6_ = auVar408._10_6_;
        auVar407[8] = 0;
        auVar407._0_8_ = uVar3;
        bVar401 = (byte)(uVar4 >> 0x20);
        auVar407[9] = bVar401;
        bVar354 = (byte)(uVar3 >> 0x20);
        auVar406._9_7_ = auVar407._9_7_;
        auVar406[8] = bVar354;
        auVar406._0_8_ = uVar3;
        auVar405._8_8_ = auVar406._8_8_;
        uVar402 = (undefined1)(uVar4 >> 0x18);
        auVar405[7] = uVar402;
        uVar326 = (undefined1)(uVar3 >> 0x18);
        auVar405[6] = uVar326;
        uVar400 = (undefined1)(uVar4 >> 0x10);
        auVar405[5] = uVar400;
        uVar325 = (undefined1)(uVar3 >> 0x10);
        auVar405[4] = uVar325;
        uVar343 = (undefined1)(uVar4 >> 8);
        auVar405[3] = uVar343;
        uVar324 = (undefined1)(uVar3 >> 8);
        auVar405[2] = uVar324;
        bVar377 = (byte)uVar4;
        auVar405._0_2_ = CONCAT11(bVar377,(byte)uVar3);
        auVar32[0xd] = 0;
        auVar32._0_13_ = auVar390._0_13_;
        auVar32[0xe] = auVar390[7];
        auVar60[0xc] = auVar390[6];
        auVar60._0_12_ = auVar390._0_12_;
        auVar60._13_2_ = auVar32._13_2_;
        auVar88[0xb] = 0;
        auVar88._0_11_ = auVar390._0_11_;
        auVar88._12_3_ = auVar60._12_3_;
        auVar116[10] = auVar390[5];
        auVar116._0_10_ = auVar390._0_10_;
        auVar116._11_4_ = auVar88._11_4_;
        auVar144[9] = 0;
        auVar144._0_9_ = auVar390._0_9_;
        auVar144._10_5_ = auVar116._10_5_;
        auVar172[8] = auVar390[4];
        auVar172._0_8_ = auVar390._0_8_;
        auVar172._9_6_ = auVar144._9_6_;
        auVar230._7_8_ = 0;
        auVar230._0_7_ = auVar172._8_7_;
        auVar270._1_8_ = SUB158(auVar230 << 0x40,7);
        auVar270[0] = auVar390[3];
        auVar270._9_6_ = 0;
        auVar271._1_10_ = SUB1510(auVar270 << 0x30,5);
        auVar271[0] = auVar390[2];
        auVar271._11_4_ = 0;
        auVar200[2] = auVar390[1];
        auVar200._0_2_ = auVar390._0_2_;
        auVar200._3_12_ = SUB1512(auVar271 << 0x20,3);
        auVar460._0_2_ = auVar390._0_2_ & 0xff;
        auVar460._2_13_ = auVar200._2_13_;
        auVar460[0xf] = 0;
        auVar461 = pmaddwd(auVar460,auVar420);
        auVar528[1] = 0;
        auVar528[0] = auVar520[8];
        auVar528[2] = auVar520[9];
        auVar528[3] = 0;
        auVar528[4] = auVar520[10];
        auVar528[5] = 0;
        auVar528[6] = auVar520[0xb];
        auVar528[7] = 0;
        auVar528[8] = auVar520[0xc];
        auVar528[9] = 0;
        auVar528[10] = auVar520[0xd];
        auVar528[0xb] = 0;
        auVar528[0xc] = auVar520[0xe];
        auVar528[0xd] = 0;
        auVar528[0xe] = auVar520[0xf];
        auVar528[0xf] = 0;
        auVar339[1] = 0;
        auVar339[0] = auVar391[8];
        auVar339[2] = auVar391[9];
        auVar339[3] = 0;
        auVar339[4] = auVar391[10];
        auVar339[5] = 0;
        auVar339[6] = auVar391[0xb];
        auVar339[7] = 0;
        auVar339[8] = auVar391[0xc];
        auVar339[9] = 0;
        auVar339[10] = auVar391[0xd];
        auVar339[0xb] = 0;
        auVar339[0xc] = auVar391[0xe];
        auVar339[0xd] = 0;
        auVar339[0xe] = auVar391[0xf];
        auVar339[0xf] = 0;
        auVar359[1] = 0;
        auVar359[0] = auVar436[8];
        auVar359[2] = auVar436[9];
        auVar359[3] = 0;
        auVar359[4] = auVar436[10];
        auVar359[5] = 0;
        auVar359[6] = auVar436[0xb];
        auVar359[7] = 0;
        auVar359[8] = auVar436[0xc];
        auVar359[9] = 0;
        auVar359[10] = auVar436[0xd];
        auVar359[0xb] = 0;
        auVar359[0xc] = auVar436[0xe];
        auVar359[0xd] = 0;
        auVar359[0xe] = auVar436[0xf];
        auVar359[0xf] = 0;
        auVar529 = pmaddwd(auVar528,auVar356);
        auVar340 = pmaddwd(auVar339,auVar368);
        auVar530[1] = 0;
        auVar530[0] = local_f8[8];
        auVar530[2] = local_f8[9];
        auVar530[3] = 0;
        auVar530[4] = local_f8[10];
        auVar530[5] = 0;
        auVar530[6] = local_f8[0xb];
        auVar530[7] = 0;
        auVar530[8] = local_f8[0xc];
        auVar530[9] = 0;
        auVar530[10] = local_f8[0xd];
        auVar530[0xb] = 0;
        auVar530[0xc] = local_f8[0xe];
        auVar530[0xd] = 0;
        auVar530[0xe] = local_f8[0xf];
        auVar530[0xf] = 0;
        auVar360 = pmaddwd(auVar359,auVar217);
        auVar531 = pmaddwd(auVar530,auVar216);
        auVar423[1] = 0;
        auVar423[0] = auVar390[8];
        auVar423[2] = auVar390[9];
        auVar423[3] = 0;
        auVar423[4] = auVar390[10];
        auVar423[5] = 0;
        auVar423[6] = auVar390[0xb];
        auVar423[7] = 0;
        auVar423[8] = auVar390[0xc];
        auVar423[9] = 0;
        auVar423[10] = auVar390[0xd];
        auVar423[0xb] = 0;
        auVar423[0xc] = auVar390[0xe];
        auVar423[0xd] = 0;
        auVar423[0xe] = auVar390[0xf];
        auVar423[0xf] = 0;
        auVar424 = pmaddwd(auVar423,auVar420);
        auVar33[0xd] = 0;
        auVar33._0_13_ = auVar405._0_13_;
        auVar33[0xe] = uVar402;
        auVar61[0xc] = uVar326;
        auVar61._0_12_ = auVar405._0_12_;
        auVar61._13_2_ = auVar33._13_2_;
        auVar89[0xb] = 0;
        auVar89._0_11_ = auVar405._0_11_;
        auVar89._12_3_ = auVar61._12_3_;
        auVar117[10] = uVar400;
        auVar117._0_10_ = auVar405._0_10_;
        auVar117._11_4_ = auVar89._11_4_;
        auVar145[9] = 0;
        auVar145._0_9_ = auVar405._0_9_;
        auVar145._10_5_ = auVar117._10_5_;
        auVar173[8] = uVar325;
        auVar173._0_8_ = auVar405._0_8_;
        auVar173._9_6_ = auVar145._9_6_;
        auVar231._7_8_ = 0;
        auVar231._0_7_ = auVar173._8_7_;
        auVar272._1_8_ = SUB158(auVar231 << 0x40,7);
        auVar272[0] = uVar343;
        auVar272._9_6_ = 0;
        auVar273._1_10_ = SUB1510(auVar272 << 0x30,5);
        auVar273[0] = uVar324;
        auVar273._11_4_ = 0;
        auVar201[2] = bVar377;
        auVar201._0_2_ = auVar405._0_2_;
        auVar201._3_12_ = SUB1512(auVar273 << 0x20,3);
        auVar361[1] = 0;
        auVar361[0] = (byte)uVar3;
        auVar361._2_13_ = auVar201._2_13_;
        auVar361[0xf] = 0;
        auVar362 = pmaddwd(auVar361,local_108);
        auVar341[1] = 0;
        auVar341[0] = bVar354;
        auVar341[2] = bVar401;
        auVar341[3] = 0;
        auVar341[4] = uVar327;
        auVar341[5] = 0;
        auVar341[6] = uVar403;
        auVar341[7] = 0;
        auVar341[8] = uVar328;
        auVar341[9] = 0;
        auVar341[10] = uVar404;
        auVar341[0xb] = 0;
        auVar341[0xc] = uVar329;
        auVar341[0xd] = 0;
        auVar341[0xe] = uVar472;
        auVar341[0xf] = 0;
        auVar342 = pmaddwd(auVar341,local_108);
        uVar3 = *(ulong *)(puVar309 + lVar310);
        auVar462._0_4_ =
             auVar461._0_4_ + auVar358._0_4_ + auVar495._0_4_ + auVar422._0_4_ + auVar459._0_4_ +
             0x40 + auVar362._0_4_ >> 7;
        auVar462._4_4_ =
             auVar461._4_4_ + auVar358._4_4_ + auVar495._4_4_ + auVar422._4_4_ + auVar459._4_4_ +
             0x40 + auVar362._4_4_ >> 7;
        auVar462._8_4_ =
             auVar461._8_4_ + auVar358._8_4_ + auVar495._8_4_ + auVar422._8_4_ + auVar459._8_4_ +
             0x40 + auVar362._8_4_ >> 7;
        auVar462._12_4_ =
             auVar461._12_4_ + auVar358._12_4_ + auVar495._12_4_ + auVar422._12_4_ + auVar459._12_4_
             + 0x40 + auVar362._12_4_ >> 7;
        auVar425._0_4_ =
             auVar424._0_4_ + auVar531._0_4_ + auVar360._0_4_ + auVar340._0_4_ + auVar529._0_4_ +
             0x40 + auVar342._0_4_ >> 7;
        auVar425._4_4_ =
             auVar424._4_4_ + auVar531._4_4_ + auVar360._4_4_ + auVar340._4_4_ + auVar529._4_4_ +
             0x40 + auVar342._4_4_ >> 7;
        auVar425._8_4_ =
             auVar424._8_4_ + auVar531._8_4_ + auVar360._8_4_ + auVar340._8_4_ + auVar529._8_4_ +
             0x40 + auVar342._8_4_ >> 7;
        auVar425._12_4_ =
             auVar424._12_4_ + auVar531._12_4_ + auVar360._12_4_ + auVar340._12_4_ + auVar529._12_4_
             + 0x40 + auVar342._12_4_ >> 7;
        auVar340 = packssdw(auVar462,auVar425);
        sVar13 = auVar340._0_2_;
        sVar14 = auVar340._2_2_;
        sVar15 = auVar340._4_2_;
        sVar16 = auVar340._6_2_;
        sVar17 = auVar340._8_2_;
        sVar18 = auVar340._10_2_;
        sVar19 = auVar340._12_2_;
        sVar20 = auVar340._14_2_;
        *(ulong *)puVar307 =
             CONCAT17((0 < sVar20) * (sVar20 < 0x100) * auVar340[0xe] - (0xff < sVar20),
                      CONCAT16((0 < sVar19) * (sVar19 < 0x100) * auVar340[0xc] - (0xff < sVar19),
                               CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar340[10] -
                                        (0xff < sVar18),
                                        CONCAT14((0 < sVar17) * (sVar17 < 0x100) * auVar340[8] -
                                                 (0xff < sVar17),
                                                 CONCAT13((0 < sVar16) * (sVar16 < 0x100) *
                                                          auVar340[6] - (0xff < sVar16),
                                                          CONCAT12((0 < sVar15) * (sVar15 < 0x100) *
                                                                   auVar340[4] - (0xff < sVar15),
                                                                   CONCAT11((0 < sVar14) *
                                                                            (sVar14 < 0x100) *
                                                                            auVar340[2] -
                                                                            (0xff < sVar14),
                                                                            (0 < sVar13) *
                                                                            (sVar13 < 0x100) *
                                                                            auVar340[0] -
                                                                            (0xff < sVar13))))))));
        auVar34[0xd] = 0;
        auVar34._0_13_ = auVar378._0_13_;
        auVar34[0xe] = auVar378[7];
        auVar62[0xc] = auVar378[6];
        auVar62._0_12_ = auVar378._0_12_;
        auVar62._13_2_ = auVar34._13_2_;
        auVar90[0xb] = 0;
        auVar90._0_11_ = auVar378._0_11_;
        auVar90._12_3_ = auVar62._12_3_;
        auVar118[10] = auVar378[5];
        auVar118._0_10_ = auVar378._0_10_;
        auVar118._11_4_ = auVar90._11_4_;
        auVar146[9] = 0;
        auVar146._0_9_ = auVar378._0_9_;
        auVar146._10_5_ = auVar118._10_5_;
        auVar174[8] = auVar378[4];
        auVar174._0_8_ = auVar378._0_8_;
        auVar174._9_6_ = auVar146._9_6_;
        auVar232._7_8_ = 0;
        auVar232._0_7_ = auVar174._8_7_;
        auVar274._1_8_ = SUB158(auVar232 << 0x40,7);
        auVar274[0] = auVar378[3];
        auVar274._9_6_ = 0;
        auVar275._1_10_ = SUB1510(auVar274 << 0x30,5);
        auVar275[0] = auVar378[2];
        auVar275._11_4_ = 0;
        auVar202[2] = auVar378[1];
        auVar202._0_2_ = auVar378._0_2_;
        auVar202._3_12_ = SUB1512(auVar275 << 0x20,3);
        auVar363._0_2_ = auVar378._0_2_ & 0xff;
        auVar363._2_13_ = auVar202._2_13_;
        auVar363[0xf] = 0;
        auVar35[0xd] = 0;
        auVar35._0_13_ = auVar536._0_13_;
        auVar35[0xe] = auVar536[7];
        auVar63[0xc] = auVar536[6];
        auVar63._0_12_ = auVar536._0_12_;
        auVar63._13_2_ = auVar35._13_2_;
        auVar91[0xb] = 0;
        auVar91._0_11_ = auVar536._0_11_;
        auVar91._12_3_ = auVar63._12_3_;
        auVar119[10] = auVar536[5];
        auVar119._0_10_ = auVar536._0_10_;
        auVar119._11_4_ = auVar91._11_4_;
        auVar147[9] = 0;
        auVar147._0_9_ = auVar536._0_9_;
        auVar147._10_5_ = auVar119._10_5_;
        auVar175[8] = auVar536[4];
        auVar175._0_8_ = auVar536._0_8_;
        auVar175._9_6_ = auVar147._9_6_;
        auVar233._7_8_ = 0;
        auVar233._0_7_ = auVar175._8_7_;
        auVar276._1_8_ = SUB158(auVar233 << 0x40,7);
        auVar276[0] = auVar536[3];
        auVar276._9_6_ = 0;
        auVar277._1_10_ = SUB1510(auVar276 << 0x30,5);
        auVar277[0] = auVar536[2];
        auVar277._11_4_ = 0;
        auVar203[2] = auVar536[1];
        auVar203._0_2_ = auVar536._0_2_;
        auVar203._3_12_ = SUB1512(auVar277 << 0x20,3);
        auVar532._0_2_ = auVar536._0_2_ & 0xff;
        auVar532._2_13_ = auVar203._2_13_;
        auVar532[0xf] = 0;
        auVar36[0xd] = 0;
        auVar36._0_13_ = local_e8._0_13_;
        auVar36[0xe] = local_e8[7];
        auVar64[0xc] = local_e8[6];
        auVar64._0_12_ = local_e8._0_12_;
        auVar64._13_2_ = auVar36._13_2_;
        auVar92[0xb] = 0;
        auVar92._0_11_ = local_e8._0_11_;
        auVar92._12_3_ = auVar64._12_3_;
        auVar120[10] = local_e8[5];
        auVar120._0_10_ = local_e8._0_10_;
        auVar120._11_4_ = auVar92._11_4_;
        auVar148[9] = 0;
        auVar148._0_9_ = local_e8._0_9_;
        auVar148._10_5_ = auVar120._10_5_;
        auVar176[8] = local_e8[4];
        auVar176._0_8_ = local_e8._0_8_;
        auVar176._9_6_ = auVar148._9_6_;
        auVar234._7_8_ = 0;
        auVar234._0_7_ = auVar176._8_7_;
        auVar278._1_8_ = SUB158(auVar234 << 0x40,7);
        auVar278[0] = local_e8[3];
        auVar278._9_6_ = 0;
        auVar279._1_10_ = SUB1510(auVar278 << 0x30,5);
        auVar279[0] = local_e8[2];
        auVar279._11_4_ = 0;
        auVar204[2] = local_e8[1];
        auVar204._0_2_ = local_e8._0_2_;
        auVar204._3_12_ = SUB1512(auVar279 << 0x20,3);
        auVar426._0_2_ = local_e8._0_2_ & 0xff;
        auVar426._2_13_ = auVar204._2_13_;
        auVar426[0xf] = 0;
        auVar340 = pmaddwd(auVar363,auVar356);
        auVar531 = pmaddwd(auVar532,auVar368);
        auVar37[0xd] = 0;
        auVar37._0_13_ = auVar331._0_13_;
        auVar37[0xe] = auVar331[7];
        auVar65[0xc] = auVar331[6];
        auVar65._0_12_ = auVar331._0_12_;
        auVar65._13_2_ = auVar37._13_2_;
        auVar93[0xb] = 0;
        auVar93._0_11_ = auVar331._0_11_;
        auVar93._12_3_ = auVar65._12_3_;
        auVar121[10] = auVar331[5];
        auVar121._0_10_ = auVar331._0_10_;
        auVar121._11_4_ = auVar93._11_4_;
        auVar149[9] = 0;
        auVar149._0_9_ = auVar331._0_9_;
        auVar149._10_5_ = auVar121._10_5_;
        auVar177[8] = auVar331[4];
        auVar177._0_8_ = auVar331._0_8_;
        auVar177._9_6_ = auVar149._9_6_;
        auVar235._7_8_ = 0;
        auVar235._0_7_ = auVar177._8_7_;
        auVar280._1_8_ = SUB158(auVar235 << 0x40,7);
        auVar280[0] = auVar331[3];
        auVar280._9_6_ = 0;
        auVar281._1_10_ = SUB1510(auVar280 << 0x30,5);
        auVar281[0] = auVar331[2];
        auVar281._11_4_ = 0;
        auVar205[2] = auVar331[1];
        auVar205._0_2_ = auVar331._0_2_;
        auVar205._3_12_ = SUB1512(auVar281 << 0x20,3);
        auVar364._0_2_ = auVar331._0_2_ & 0xff;
        auVar364._2_13_ = auVar205._2_13_;
        auVar364[0xf] = 0;
        auVar461 = pmaddwd(auVar426,auVar217);
        auVar342 = pmaddwd(auVar364,auVar216);
        auVar38[0xd] = 0;
        auVar38._0_13_ = auVar486._0_13_;
        auVar38[0xe] = auVar486[7];
        auVar66[0xc] = auVar486[6];
        auVar66._0_12_ = auVar486._0_12_;
        auVar66._13_2_ = auVar38._13_2_;
        auVar94[0xb] = 0;
        auVar94._0_11_ = auVar486._0_11_;
        auVar94._12_3_ = auVar66._12_3_;
        auVar122[10] = auVar486[5];
        auVar122._0_10_ = auVar486._0_10_;
        auVar122._11_4_ = auVar94._11_4_;
        auVar150[9] = 0;
        auVar150._0_9_ = auVar486._0_9_;
        auVar150._10_5_ = auVar122._10_5_;
        auVar178[8] = auVar486[4];
        auVar178._0_8_ = auVar486._0_8_;
        auVar178._9_6_ = auVar150._9_6_;
        auVar236._7_8_ = 0;
        auVar236._0_7_ = auVar178._8_7_;
        auVar282._1_8_ = SUB158(auVar236 << 0x40,7);
        auVar282[0] = auVar486[3];
        auVar282._9_6_ = 0;
        auVar283._1_10_ = SUB1510(auVar282 << 0x30,5);
        auVar283[0] = auVar486[2];
        auVar283._11_4_ = 0;
        auVar206[2] = auVar486[1];
        auVar206._0_2_ = auVar486._0_2_;
        auVar206._3_12_ = SUB1512(auVar283 << 0x20,3);
        auVar463._0_2_ = auVar486._0_2_ & 0xff;
        auVar463._2_13_ = auVar206._2_13_;
        auVar463[0xf] = 0;
        auVar529 = pmaddwd(auVar463,auVar420);
        auVar386[1] = 0;
        auVar386[0] = auVar378[8];
        auVar386[2] = auVar378[9];
        auVar386[3] = 0;
        auVar386[4] = auVar378[10];
        auVar386[5] = 0;
        auVar386[6] = auVar378[0xb];
        auVar386[7] = 0;
        auVar386[8] = auVar378[0xc];
        auVar386[9] = 0;
        auVar386[10] = auVar378[0xd];
        auVar386[0xb] = 0;
        auVar386[0xc] = auVar378[0xe];
        auVar386[0xd] = 0;
        auVar386[0xe] = auVar378[0xf];
        auVar386[0xf] = 0;
        auVar427[1] = 0;
        auVar427[0] = auVar536[8];
        auVar427[2] = auVar536[9];
        auVar427[3] = 0;
        auVar427[4] = auVar536[10];
        auVar427[5] = 0;
        auVar427[6] = auVar536[0xb];
        auVar427[7] = 0;
        auVar427[8] = auVar536[0xc];
        auVar427[9] = 0;
        auVar427[10] = auVar536[0xd];
        auVar427[0xb] = 0;
        auVar427[0xc] = auVar536[0xe];
        auVar427[0xd] = 0;
        auVar427[0xe] = auVar536[0xf];
        auVar427[0xf] = 0;
        auVar365[1] = 0;
        auVar365[0] = local_e8[8];
        auVar365[2] = local_e8[9];
        auVar365[3] = 0;
        auVar365[4] = local_e8[10];
        auVar365[5] = 0;
        auVar365[6] = local_e8[0xb];
        auVar365[7] = 0;
        auVar365[8] = local_e8[0xc];
        auVar365[9] = 0;
        auVar365[10] = local_e8[0xd];
        auVar365[0xb] = 0;
        auVar365[0xc] = local_e8[0xe];
        auVar365[0xd] = 0;
        auVar365[0xe] = local_e8[0xf];
        auVar365[0xf] = 0;
        auVar362 = pmaddwd(auVar386,auVar356);
        auVar495 = pmaddwd(auVar427,auVar368);
        auVar387[1] = 0;
        auVar387[0] = auVar331[8];
        auVar387[2] = auVar331[9];
        auVar387[3] = 0;
        auVar387[4] = auVar331[10];
        auVar387[5] = 0;
        auVar387[6] = auVar331[0xb];
        auVar387[7] = 0;
        auVar387[8] = auVar331[0xc];
        auVar387[9] = 0;
        auVar387[10] = auVar331[0xd];
        auVar387[0xb] = 0;
        auVar387[0xc] = auVar331[0xe];
        auVar387[0xd] = 0;
        auVar387[0xe] = auVar331[0xf];
        auVar387[0xf] = 0;
        auVar358 = pmaddwd(auVar365,auVar217);
        auVar422 = pmaddwd(auVar387,auVar216);
        uVar330 = (undefined1)(uVar3 >> 0x38);
        auVar503._8_6_ = 0;
        auVar503._0_8_ = uVar4;
        auVar503[0xe] = uVar472;
        auVar503[0xf] = uVar330;
        uVar329 = (undefined1)(uVar3 >> 0x30);
        auVar502._14_2_ = auVar503._14_2_;
        auVar502._8_5_ = 0;
        auVar502._0_8_ = uVar4;
        auVar502[0xd] = uVar329;
        auVar501._13_3_ = auVar502._13_3_;
        auVar501._8_4_ = 0;
        auVar501._0_8_ = uVar4;
        auVar501[0xc] = uVar404;
        uVar328 = (undefined1)(uVar3 >> 0x28);
        auVar500._12_4_ = auVar501._12_4_;
        auVar500._8_3_ = 0;
        auVar500._0_8_ = uVar4;
        auVar500[0xb] = uVar328;
        auVar499._11_5_ = auVar500._11_5_;
        auVar499._8_2_ = 0;
        auVar499._0_8_ = uVar4;
        auVar499[10] = uVar403;
        uVar327 = (undefined1)(uVar3 >> 0x20);
        auVar498._10_6_ = auVar499._10_6_;
        auVar498[8] = 0;
        auVar498._0_8_ = uVar4;
        auVar498[9] = uVar327;
        auVar497._9_7_ = auVar498._9_7_;
        auVar497[8] = bVar401;
        auVar497._0_8_ = uVar4;
        uVar326 = (undefined1)(uVar3 >> 0x18);
        auVar496._8_8_ = auVar497._8_8_;
        auVar496[7] = uVar326;
        auVar496[6] = uVar402;
        uVar325 = (undefined1)(uVar3 >> 0x10);
        auVar496[5] = uVar325;
        auVar496[4] = uVar400;
        uVar324 = (undefined1)(uVar3 >> 8);
        auVar496[3] = uVar324;
        auVar496[2] = uVar343;
        auVar496._0_2_ = CONCAT11((char)uVar3,bVar377);
        auVar366[1] = 0;
        auVar366[0] = auVar486[8];
        auVar366[2] = auVar486[9];
        auVar366[3] = 0;
        auVar366[4] = auVar486[10];
        auVar366[5] = 0;
        auVar366[6] = auVar486[0xb];
        auVar366[7] = 0;
        auVar366[8] = auVar486[0xc];
        auVar366[9] = 0;
        auVar366[10] = auVar486[0xd];
        auVar366[0xb] = 0;
        auVar366[0xc] = auVar486[0xe];
        auVar366[0xd] = 0;
        auVar366[0xe] = auVar486[0xf];
        auVar366[0xf] = 0;
        auVar360 = pmaddwd(auVar366,auVar420);
        auVar39[0xd] = 0;
        auVar39._0_13_ = auVar496._0_13_;
        auVar39[0xe] = uVar326;
        auVar67[0xc] = uVar402;
        auVar67._0_12_ = auVar496._0_12_;
        auVar67._13_2_ = auVar39._13_2_;
        auVar95[0xb] = 0;
        auVar95._0_11_ = auVar496._0_11_;
        auVar95._12_3_ = auVar67._12_3_;
        auVar123[10] = uVar325;
        auVar123._0_10_ = auVar496._0_10_;
        auVar123._11_4_ = auVar95._11_4_;
        auVar151[9] = 0;
        auVar151._0_9_ = auVar496._0_9_;
        auVar151._10_5_ = auVar123._10_5_;
        auVar179[8] = uVar400;
        auVar179._0_8_ = auVar496._0_8_;
        auVar179._9_6_ = auVar151._9_6_;
        auVar237._7_8_ = 0;
        auVar237._0_7_ = auVar179._8_7_;
        auVar284._1_8_ = SUB158(auVar237 << 0x40,7);
        auVar284[0] = uVar324;
        auVar284._9_6_ = 0;
        auVar285._1_10_ = SUB1510(auVar284 << 0x30,5);
        auVar285[0] = uVar343;
        auVar285._11_4_ = 0;
        auVar207[2] = (char)uVar3;
        auVar207._0_2_ = auVar496._0_2_;
        auVar207._3_12_ = SUB1512(auVar285 << 0x20,3);
        auVar388[1] = 0;
        auVar388[0] = bVar377;
        auVar388._2_13_ = auVar207._2_13_;
        auVar388[0xf] = 0;
        auVar424 = pmaddwd(auVar388,local_108);
        auVar389[1] = 0;
        auVar389[0] = bVar401;
        auVar389[2] = uVar327;
        auVar389[3] = 0;
        auVar389[4] = uVar403;
        auVar389[5] = 0;
        auVar389[6] = uVar328;
        auVar389[7] = 0;
        auVar389[8] = uVar404;
        auVar389[9] = 0;
        auVar389[10] = uVar329;
        auVar389[0xb] = 0;
        auVar389[0xc] = uVar472;
        auVar389[0xd] = 0;
        auVar389[0xe] = uVar330;
        auVar389[0xf] = 0;
        auVar459 = pmaddwd(auVar389,local_108);
        auVar464._0_4_ =
             auVar529._0_4_ + auVar342._0_4_ + auVar461._0_4_ + auVar531._0_4_ + auVar340._0_4_ +
             0x40 + auVar424._0_4_ >> 7;
        auVar464._4_4_ =
             auVar529._4_4_ + auVar342._4_4_ + auVar461._4_4_ + auVar531._4_4_ + auVar340._4_4_ +
             0x40 + auVar424._4_4_ >> 7;
        auVar464._8_4_ =
             auVar529._8_4_ + auVar342._8_4_ + auVar461._8_4_ + auVar531._8_4_ + auVar340._8_4_ +
             0x40 + auVar424._8_4_ >> 7;
        auVar464._12_4_ =
             auVar529._12_4_ + auVar342._12_4_ + auVar461._12_4_ + auVar531._12_4_ + auVar340._12_4_
             + 0x40 + auVar424._12_4_ >> 7;
        auVar367._0_4_ =
             auVar360._0_4_ + auVar422._0_4_ + auVar358._0_4_ + auVar495._0_4_ + auVar362._0_4_ +
             0x40 + auVar459._0_4_ >> 7;
        auVar367._4_4_ =
             auVar360._4_4_ + auVar422._4_4_ + auVar358._4_4_ + auVar495._4_4_ + auVar362._4_4_ +
             0x40 + auVar459._4_4_ >> 7;
        auVar367._8_4_ =
             auVar360._8_4_ + auVar422._8_4_ + auVar358._8_4_ + auVar495._8_4_ + auVar362._8_4_ +
             0x40 + auVar459._8_4_ >> 7;
        auVar367._12_4_ =
             auVar360._12_4_ + auVar422._12_4_ + auVar358._12_4_ + auVar495._12_4_ + auVar362._12_4_
             + 0x40 + auVar459._12_4_ >> 7;
        auVar340 = packssdw(auVar464,auVar367);
        sVar13 = auVar340._0_2_;
        sVar14 = auVar340._2_2_;
        sVar15 = auVar340._4_2_;
        sVar16 = auVar340._6_2_;
        sVar17 = auVar340._8_2_;
        sVar18 = auVar340._10_2_;
        sVar19 = auVar340._12_2_;
        sVar20 = auVar340._14_2_;
        *(ulong *)(puVar307 + dst_stride) =
             CONCAT17((0 < sVar20) * (sVar20 < 0x100) * auVar340[0xe] - (0xff < sVar20),
                      CONCAT16((0 < sVar19) * (sVar19 < 0x100) * auVar340[0xc] - (0xff < sVar19),
                               CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar340[10] -
                                        (0xff < sVar18),
                                        CONCAT14((0 < sVar17) * (sVar17 < 0x100) * auVar340[8] -
                                                 (0xff < sVar17),
                                                 CONCAT13((0 < sVar16) * (sVar16 < 0x100) *
                                                          auVar340[6] - (0xff < sVar16),
                                                          CONCAT12((0 < sVar15) * (sVar15 < 0x100) *
                                                                   auVar340[4] - (0xff < sVar15),
                                                                   CONCAT11((0 < sVar14) *
                                                                            (sVar14 < 0x100) *
                                                                            auVar340[2] -
                                                                            (0xff < sVar14),
                                                                            (0 < sVar13) *
                                                                            (sVar13 < 0x100) *
                                                                            auVar340[0] -
                                                                            (0xff < sVar13))))))));
        lVar311 = lVar311 + 2;
        puVar307 = puVar307 + (long)dst_stride * 2;
        puVar309 = puVar309 + lVar312 * 2;
        auVar316 = local_f8;
        auVar346 = auVar486;
        auVar378 = auVar536;
        auVar486 = auVar496;
        auVar520 = auVar391;
        auVar536 = local_e8;
        local_f8 = auVar390;
        local_e8 = auVar331;
      } while (lVar311 < h);
      uVar314 = uVar314 + 8;
      dst = dst + 8;
      lVar308 = lVar308 + 8;
      lVar310 = lVar310 + 8;
    } while (uVar314 < (uint)w);
  }
  return;
}

Assistant:

void av1_convolve_y_sr_sse2(const uint8_t *src, int src_stride, uint8_t *dst,
                            int dst_stride, int w, int h,
                            const InterpFilterParams *filter_params_y,
                            const int subpel_y_qn) {
  if (filter_params_y->taps > 8) {
    if (w < 8) {
      av1_convolve_y_sr_c(src, src_stride, dst, dst_stride, w, h,
                          filter_params_y, subpel_y_qn);
    } else {
      convolve_y_sr_12tap_sse2(src, src_stride, dst, dst_stride, w, h,
                               filter_params_y, subpel_y_qn);
    }
  } else {
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const uint8_t *src_ptr = src - fo_vert * src_stride;
    const __m128i round_const = _mm_set1_epi32((1 << FILTER_BITS) >> 1);
    const __m128i round_shift = _mm_cvtsi32_si128(FILTER_BITS);
    __m128i coeffs[4];

    prepare_coeffs(filter_params_y, subpel_y_qn, coeffs);

    if (w <= 4) {
      __m128i s[8], src6, res, res_round, res16;
      int res_int;
      s[0] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 0 * src_stride),
                               xx_loadl_32(src_ptr + 1 * src_stride));
      s[1] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 1 * src_stride),
                               xx_loadl_32(src_ptr + 2 * src_stride));
      s[2] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 2 * src_stride),
                               xx_loadl_32(src_ptr + 3 * src_stride));
      s[3] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 3 * src_stride),
                               xx_loadl_32(src_ptr + 4 * src_stride));
      s[4] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 4 * src_stride),
                               xx_loadl_32(src_ptr + 5 * src_stride));
      src6 = xx_loadl_32(src_ptr + 6 * src_stride);
      s[5] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 5 * src_stride), src6);

      do {
        s[6] = _mm_unpacklo_epi8(src6, xx_loadl_32(src_ptr + 7 * src_stride));
        src6 = xx_loadl_32(src_ptr + 8 * src_stride);
        s[7] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 7 * src_stride), src6);

        res = convolve_lo_y(s + 0, coeffs);
        res_round = _mm_sra_epi32(_mm_add_epi32(res, round_const), round_shift);
        res16 = _mm_packs_epi32(res_round, res_round);
        res_int = _mm_cvtsi128_si32(_mm_packus_epi16(res16, res16));

        if (w == 2)
          *(uint16_t *)dst = (uint16_t)res_int;
        else
          *(int *)dst = res_int;

        src_ptr += src_stride;
        dst += dst_stride;

        res = convolve_lo_y(s + 1, coeffs);
        res_round = _mm_sra_epi32(_mm_add_epi32(res, round_const), round_shift);
        res16 = _mm_packs_epi32(res_round, res_round);
        res_int = _mm_cvtsi128_si32(_mm_packus_epi16(res16, res16));

        if (w == 2)
          *(uint16_t *)dst = (uint16_t)res_int;
        else
          *(int *)dst = res_int;

        src_ptr += src_stride;
        dst += dst_stride;

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
        s[3] = s[5];
        s[4] = s[6];
        s[5] = s[7];
        h -= 2;
      } while (h);
    } else {
      assert(!(w % 8));
      int j = 0;
      do {
        __m128i s[8], src6, res_lo, res_hi;
        __m128i res_lo_round, res_hi_round, res16, res;
        const uint8_t *data = &src_ptr[j];

        src6 = _mm_loadl_epi64((__m128i *)(data + 6 * src_stride));
        s[0] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 0 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)));
        s[1] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)));
        s[2] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)));
        s[3] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)));
        s[4] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)));
        s[5] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)), src6);

        int i = 0;
        do {
          data = &src_ptr[i * src_stride + j];
          s[6] = _mm_unpacklo_epi8(
              src6, _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)));
          src6 = _mm_loadl_epi64((__m128i *)(data + 8 * src_stride));
          s[7] = _mm_unpacklo_epi8(
              _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)), src6);

          res_lo = convolve_lo_y(s, coeffs);  // Filter low index pixels
          res_hi = convolve_hi_y(s, coeffs);  // Filter high index pixels

          res_lo_round =
              _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
          res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

          res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          res = _mm_packus_epi16(res16, res16);

          _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
          i++;

          res_lo = convolve_lo_y(s + 1, coeffs);  // Filter low index pixels
          res_hi = convolve_hi_y(s + 1, coeffs);  // Filter high index pixels

          res_lo_round =
              _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
          res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

          res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          res = _mm_packus_epi16(res16, res16);

          _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
          i++;

          s[0] = s[2];
          s[1] = s[3];
          s[2] = s[4];
          s[3] = s[5];
          s[4] = s[6];
          s[5] = s[7];
        } while (i < h);
        j += 8;
      } while (j < w);
    }
  }
}